

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_zinv_var
               (secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *bzinv)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  int iVar881;
  ulong uVar882;
  ulong uVar883;
  ulong uVar884;
  long lVar885;
  ulong uVar886;
  ulong uVar887;
  ulong uVar888;
  ulong uVar889;
  ulong uVar890;
  ulong uVar891;
  ulong uVar892;
  ulong uVar893;
  ulong uVar894;
  ulong uVar895;
  ulong uVar896;
  ulong uVar897;
  ulong uVar898;
  ulong uVar899;
  ulong uVar900;
  ulong uVar901;
  ulong uVar902;
  ulong uVar903;
  ulong uVar904;
  ulong uVar905;
  ulong uVar906;
  ulong uVar907;
  ulong uVar908;
  ulong uVar909;
  ulong uVar910;
  ulong uVar911;
  ulong uVar912;
  ulong uVar913;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      uVar888 = (a->z).n[0];
      uVar886 = (a->z).n[1];
      uVar901 = (a->z).n[2];
      uVar908 = (a->z).n[3];
      uVar884 = bzinv->n[3];
      auVar120._8_8_ = 0;
      auVar120._0_8_ = uVar884;
      auVar552._8_8_ = 0;
      auVar552._0_8_ = uVar888;
      uVar882 = bzinv->n[2];
      auVar121._8_8_ = 0;
      auVar121._0_8_ = uVar882;
      auVar553._8_8_ = 0;
      auVar553._0_8_ = uVar886;
      uVar889 = (a->z).n[4];
      uVar907 = bzinv->n[0];
      uVar883 = bzinv->n[1];
      auVar122._8_8_ = 0;
      auVar122._0_8_ = uVar883;
      auVar554._8_8_ = 0;
      auVar554._0_8_ = uVar901;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = uVar907;
      auVar555._8_8_ = 0;
      auVar555._0_8_ = uVar908;
      uVar887 = bzinv->n[4];
      auVar124._8_8_ = 0;
      auVar124._0_8_ = uVar887;
      auVar556._8_8_ = 0;
      auVar556._0_8_ = uVar889;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = SUB168(auVar124 * auVar556,0);
      auVar120 = auVar120 * auVar552 + auVar121 * auVar553 + auVar122 * auVar554 +
                 auVar123 * auVar555 + auVar125 * ZEXT816(0x1000003d10);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = uVar887;
      auVar557._8_8_ = 0;
      auVar557._0_8_ = uVar888;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uVar884;
      auVar558._8_8_ = 0;
      auVar558._0_8_ = uVar886;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = uVar882;
      auVar559._8_8_ = 0;
      auVar559._0_8_ = uVar901;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = uVar883;
      auVar560._8_8_ = 0;
      auVar560._0_8_ = uVar908;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = uVar907;
      auVar561._8_8_ = 0;
      auVar561._0_8_ = uVar889;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = SUB168(auVar124 * auVar556,8);
      auVar121 = auVar131 * ZEXT816(0x1000003d10000) +
                 auVar126 * auVar557 +
                 auVar130 * auVar561 +
                 auVar129 * auVar560 + auVar128 * auVar559 + auVar127 * auVar558 +
                 (auVar120 >> 0x34);
      auVar132._8_8_ = 0;
      auVar132._0_8_ = uVar907;
      auVar562._8_8_ = 0;
      auVar562._0_8_ = uVar888;
      auVar133._8_8_ = 0;
      auVar133._0_8_ = uVar887;
      auVar563._8_8_ = 0;
      auVar563._0_8_ = uVar886;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = uVar884;
      auVar564._8_8_ = 0;
      auVar564._0_8_ = uVar901;
      auVar135._8_8_ = 0;
      auVar135._0_8_ = uVar882;
      auVar565._8_8_ = 0;
      auVar565._0_8_ = uVar908;
      auVar136._8_8_ = 0;
      auVar136._0_8_ = uVar883;
      auVar566._8_8_ = 0;
      auVar566._0_8_ = uVar889;
      auVar122 = (auVar121 >> 0x34) +
                 auVar133 * auVar563 +
                 auVar136 * auVar566 + auVar135 * auVar565 + auVar134 * auVar564;
      uVar892 = auVar122._0_8_;
      uVar894 = auVar122._8_8_;
      auVar846._8_8_ = uVar894 >> 0x34;
      auVar846._0_8_ = uVar894 * 0x1000 | uVar892 >> 0x34;
      auVar137._8_8_ = 0;
      auVar137._0_8_ = uVar892 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar121._6_2_ & 0xf);
      auVar122 = auVar132 * auVar562 + auVar137 * ZEXT816(0x1000003d1);
      uVar894 = auVar122._0_8_;
      uVar892 = auVar122._8_8_;
      auVar138._8_8_ = 0;
      auVar138._0_8_ = uVar883;
      auVar567._8_8_ = 0;
      auVar567._0_8_ = uVar888;
      auVar139._8_8_ = 0;
      auVar139._0_8_ = uVar907;
      auVar568._8_8_ = 0;
      auVar568._0_8_ = uVar886;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = uVar887;
      auVar569._8_8_ = 0;
      auVar569._0_8_ = uVar901;
      auVar826._8_8_ = uVar892 >> 0x34;
      auVar826._0_8_ = uVar892 * 0x1000 | uVar894 >> 0x34;
      auVar141._8_8_ = 0;
      auVar141._0_8_ = uVar884;
      auVar570._8_8_ = 0;
      auVar570._0_8_ = uVar908;
      auVar142._8_8_ = 0;
      auVar142._0_8_ = uVar882;
      auVar571._8_8_ = 0;
      auVar571._0_8_ = uVar889;
      auVar846 = auVar140 * auVar569 + auVar142 * auVar571 + auVar141 * auVar570 + auVar846;
      auVar143._8_8_ = 0;
      auVar143._0_8_ = auVar846._0_8_ & 0xfffffffffffff;
      auVar826 = auVar143 * ZEXT816(0x1000003d10) + auVar138 * auVar567 + auVar139 * auVar568 +
                 auVar826;
      uVar890 = auVar826._0_8_;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = uVar882;
      auVar572._8_8_ = 0;
      auVar572._0_8_ = uVar888;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar883;
      auVar573._8_8_ = 0;
      auVar573._0_8_ = uVar886;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar907;
      auVar574._8_8_ = 0;
      auVar574._0_8_ = uVar901;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar887;
      auVar575._8_8_ = 0;
      auVar575._0_8_ = uVar908;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar884;
      auVar576._8_8_ = 0;
      auVar576._0_8_ = uVar889;
      auVar122 = auVar148 * auVar576 + auVar147 * auVar575 + (auVar846 >> 0x34);
      auVar149._8_8_ = 0;
      auVar149._0_8_ = auVar122._0_8_;
      auVar123 = auVar149 * ZEXT816(0x1000003d10) +
                 auVar144 * auVar572 + auVar145 * auVar573 + auVar146 * auVar574 +
                 (auVar826 >> 0x34);
      uVar887 = auVar123._0_8_;
      auVar123 = auVar123 >> 0x34;
      auVar848._8_8_ = 0;
      auVar848._0_8_ = auVar123._0_8_;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = auVar122._8_8_;
      auVar847._8_8_ = auVar123._8_8_;
      auVar847._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
      auVar848 = auVar150 * ZEXT816(0x1000003d10000) + auVar847 + auVar848;
      uVar884 = auVar848._0_8_;
      uVar907 = uVar894 * 2 & 0x1ffffffffffffe;
      uVar892 = uVar884 & 0xfffffffffffff;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = uVar892;
      auVar577._8_8_ = 0;
      auVar577._0_8_ = uVar907;
      uVar895 = (auVar848._8_8_ << 0xc | uVar884 >> 0x34) + (auVar121._0_8_ & 0xffffffffffff);
      uVar883 = uVar890 * 2 & 0x1ffffffffffffe;
      uVar910 = uVar887 & 0xfffffffffffff;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = uVar910;
      auVar578._8_8_ = 0;
      auVar578._0_8_ = uVar883;
      auVar153._8_8_ = 0;
      auVar153._0_8_ = uVar895;
      auVar579._8_8_ = 0;
      auVar579._0_8_ = uVar895;
      auVar154._8_8_ = 0;
      auVar154._0_8_ = SUB168(auVar153 * auVar579,0);
      auVar120 = auVar154 * ZEXT816(0x1000003d10) + auVar152 * auVar578 + auVar151 * auVar577;
      uVar882 = auVar120._0_8_;
      auVar849._8_8_ = 0;
      auVar849._0_8_ = auVar120._8_8_ << 0xc | uVar882 >> 0x34;
      uVar894 = uVar894 & 0xfffffffffffff;
      uVar884 = uVar895 * 2;
      auVar155._8_8_ = 0;
      auVar155._0_8_ = uVar894;
      auVar580._8_8_ = 0;
      auVar580._0_8_ = uVar884;
      auVar156._8_8_ = 0;
      auVar156._0_8_ = uVar892;
      auVar581._8_8_ = 0;
      auVar581._0_8_ = uVar883;
      auVar157._8_8_ = 0;
      auVar157._0_8_ = uVar910;
      auVar582._8_8_ = 0;
      auVar582._0_8_ = uVar910;
      auVar158._8_8_ = 0;
      auVar158._0_8_ = SUB168(auVar153 * auVar579,8);
      auVar849 = auVar158 * ZEXT816(0x1000003d10000) +
                 auVar155 * auVar580 + auVar157 * auVar582 + auVar156 * auVar581 + auVar849;
      auVar159._8_8_ = 0;
      auVar159._0_8_ = uVar894;
      auVar583._8_8_ = 0;
      auVar583._0_8_ = uVar894;
      uVar890 = uVar890 & 0xfffffffffffff;
      auVar160._8_8_ = 0;
      auVar160._0_8_ = uVar890;
      auVar584._8_8_ = 0;
      auVar584._0_8_ = uVar884;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = uVar892;
      auVar585._8_8_ = 0;
      auVar585._0_8_ = uVar887 * 2 & 0x1ffffffffffffe;
      auVar120 = auVar161 * auVar585 + auVar160 * auVar584 + (auVar849 >> 0x34);
      auVar162._8_8_ = 0;
      auVar162._0_8_ = (auVar120._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar849._6_2_ & 0xf);
      auVar121 = auVar162 * ZEXT816(0x1000003d1) + auVar159 * auVar583;
      uVar902 = auVar121._0_8_;
      auVar850._8_8_ = 0;
      auVar850._0_8_ = auVar121._8_8_ << 0xc | uVar902 >> 0x34;
      auVar163._8_8_ = 0;
      auVar163._0_8_ = uVar890;
      auVar586._8_8_ = 0;
      auVar586._0_8_ = uVar907;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = uVar910;
      auVar587._8_8_ = 0;
      auVar587._0_8_ = uVar884;
      auVar165._8_8_ = 0;
      auVar165._0_8_ = uVar892;
      auVar588._8_8_ = 0;
      auVar588._0_8_ = uVar892;
      auVar120 = auVar165 * auVar588 + auVar164 * auVar587 + (auVar120 >> 0x34);
      auVar166._8_8_ = 0;
      auVar166._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
      auVar850 = auVar166 * ZEXT816(0x1000003d10) + auVar163 * auVar586 + auVar850;
      uVar899 = auVar850._0_8_;
      auVar851._8_8_ = 0;
      auVar851._0_8_ = auVar850._8_8_ << 0xc | uVar899 >> 0x34;
      auVar167._8_8_ = 0;
      auVar167._0_8_ = uVar910;
      auVar589._8_8_ = 0;
      auVar589._0_8_ = uVar907;
      auVar168._8_8_ = 0;
      auVar168._0_8_ = uVar890;
      auVar590._8_8_ = 0;
      auVar590._0_8_ = uVar890;
      auVar169._8_8_ = 0;
      auVar169._0_8_ = uVar892;
      auVar591._8_8_ = 0;
      auVar591._0_8_ = uVar884;
      auVar120 = auVar169 * auVar591 + (auVar120 >> 0x34);
      auVar170._8_8_ = 0;
      auVar170._0_8_ = auVar120._0_8_;
      auVar851 = auVar170 * ZEXT816(0x1000003d10) + auVar168 * auVar590 + auVar167 * auVar589 +
                 auVar851;
      uVar905 = auVar851._0_8_;
      auVar853._8_8_ = 0;
      auVar853._0_8_ = auVar851._8_8_ << 0xc | uVar905 >> 0x34;
      auVar171._8_8_ = 0;
      auVar171._0_8_ = auVar120._8_8_;
      auVar852._8_8_ = 0;
      auVar852._0_8_ = uVar882 & 0xffffffffffffe;
      auVar853 = auVar171 * ZEXT816(0x1000003d10000) + auVar852 + auVar853;
      uVar887 = auVar853._0_8_;
      uVar898 = uVar887 & 0xfffffffffffff;
      uVar884 = (b->x).n[0];
      auVar172._8_8_ = 0;
      auVar172._0_8_ = uVar898;
      auVar592._8_8_ = 0;
      auVar592._0_8_ = uVar884;
      uVar905 = uVar905 & 0xfffffffffffff;
      uVar882 = (b->x).n[1];
      auVar173._8_8_ = 0;
      auVar173._0_8_ = uVar905;
      auVar593._8_8_ = 0;
      auVar593._0_8_ = uVar882;
      uVar899 = uVar899 & 0xfffffffffffff;
      uVar907 = (b->x).n[2];
      auVar174._8_8_ = 0;
      auVar174._0_8_ = uVar899;
      auVar594._8_8_ = 0;
      auVar594._0_8_ = uVar907;
      uVar902 = uVar902 & 0xfffffffffffff;
      uVar883 = (b->x).n[3];
      auVar175._8_8_ = 0;
      auVar175._0_8_ = uVar902;
      auVar595._8_8_ = 0;
      auVar595._0_8_ = uVar883;
      uVar891 = (auVar849._0_8_ & 0xffffffffffff) + (auVar853._8_8_ << 0xc | uVar887 >> 0x34);
      uVar887 = (b->x).n[4];
      auVar176._8_8_ = 0;
      auVar176._0_8_ = uVar891;
      auVar596._8_8_ = 0;
      auVar596._0_8_ = uVar887;
      auVar177._8_8_ = 0;
      auVar177._0_8_ = SUB168(auVar176 * auVar596,0);
      auVar120 = auVar177 * ZEXT816(0x1000003d10) +
                 auVar173 * auVar593 + auVar175 * auVar595 + auVar174 * auVar594 +
                 auVar172 * auVar592;
      auVar178._8_8_ = 0;
      auVar178._0_8_ = uVar891;
      auVar597._8_8_ = 0;
      auVar597._0_8_ = uVar884;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = uVar898;
      auVar598._8_8_ = 0;
      auVar598._0_8_ = uVar882;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = uVar905;
      auVar599._8_8_ = 0;
      auVar599._0_8_ = uVar907;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = uVar899;
      auVar600._8_8_ = 0;
      auVar600._0_8_ = uVar883;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = uVar902;
      auVar601._8_8_ = 0;
      auVar601._0_8_ = uVar887;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = SUB168(auVar176 * auVar596,8);
      auVar121 = auVar183 * ZEXT816(0x1000003d10000) +
                 auVar179 * auVar598 +
                 auVar180 * auVar599 + auVar182 * auVar601 + auVar181 * auVar600 +
                 auVar178 * auVar597 + (auVar120 >> 0x34);
      auVar184._8_8_ = 0;
      auVar184._0_8_ = uVar902;
      auVar602._8_8_ = 0;
      auVar602._0_8_ = uVar884;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = uVar891;
      auVar603._8_8_ = 0;
      auVar603._0_8_ = uVar882;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = uVar898;
      auVar604._8_8_ = 0;
      auVar604._0_8_ = uVar907;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = uVar905;
      auVar605._8_8_ = 0;
      auVar605._0_8_ = uVar883;
      auVar188._8_8_ = 0;
      auVar188._0_8_ = uVar899;
      auVar606._8_8_ = 0;
      auVar606._0_8_ = uVar887;
      auVar122 = (auVar121 >> 0x34) +
                 auVar188 * auVar606 + auVar187 * auVar605 + auVar186 * auVar604 +
                 auVar185 * auVar603;
      uVar904 = auVar122._0_8_;
      uVar893 = auVar122._8_8_;
      auVar854._8_8_ = uVar893 >> 0x34;
      auVar854._0_8_ = uVar893 * 0x1000 | uVar904 >> 0x34;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = uVar904 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar121._6_2_ & 0xf);
      auVar122 = auVar189 * ZEXT816(0x1000003d1) + auVar184 * auVar602;
      uVar904 = auVar122._0_8_;
      uVar893 = auVar122._8_8_;
      auVar827._8_8_ = uVar893 >> 0x34;
      auVar827._0_8_ = uVar893 * 0x1000 | uVar904 >> 0x34;
      auVar190._8_8_ = 0;
      auVar190._0_8_ = uVar899;
      auVar607._8_8_ = 0;
      auVar607._0_8_ = uVar884;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = uVar902;
      auVar608._8_8_ = 0;
      auVar608._0_8_ = uVar882;
      auVar192._8_8_ = 0;
      auVar192._0_8_ = uVar891;
      auVar609._8_8_ = 0;
      auVar609._0_8_ = uVar907;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = uVar898;
      auVar610._8_8_ = 0;
      auVar610._0_8_ = uVar883;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = uVar905;
      auVar611._8_8_ = 0;
      auVar611._0_8_ = uVar887;
      auVar854 = auVar192 * auVar609 + auVar194 * auVar611 + auVar193 * auVar610 + auVar854;
      auVar195._8_8_ = 0;
      auVar195._0_8_ = auVar854._0_8_ & 0xfffffffffffff;
      auVar827 = auVar195 * ZEXT816(0x1000003d10) + auVar191 * auVar608 + auVar190 * auVar607 +
                 auVar827;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = uVar905;
      auVar612._8_8_ = 0;
      auVar612._0_8_ = uVar884;
      auVar197._8_8_ = 0;
      auVar197._0_8_ = uVar899;
      auVar613._8_8_ = 0;
      auVar613._0_8_ = uVar882;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = uVar902;
      auVar614._8_8_ = 0;
      auVar614._0_8_ = uVar907;
      auVar199._8_8_ = 0;
      auVar199._0_8_ = uVar891;
      auVar615._8_8_ = 0;
      auVar615._0_8_ = uVar883;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = uVar898;
      auVar616._8_8_ = 0;
      auVar616._0_8_ = uVar887;
      auVar122 = auVar200 * auVar616 + auVar199 * auVar615 + (auVar854 >> 0x34);
      auVar201._8_8_ = 0;
      auVar201._0_8_ = auVar122._0_8_;
      auVar123 = auVar201 * ZEXT816(0x1000003d10) +
                 auVar196 * auVar612 + auVar198 * auVar614 + auVar197 * auVar613 +
                 (auVar827 >> 0x34);
      auVar124 = auVar123 >> 0x34;
      auVar856._8_8_ = 0;
      auVar856._0_8_ = auVar124._0_8_;
      auVar202._8_8_ = 0;
      auVar202._0_8_ = auVar122._8_8_;
      auVar855._8_8_ = auVar124._8_8_;
      auVar855._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
      auVar856 = auVar202 * ZEXT816(0x1000003d10000) + auVar855 + auVar856;
      uVar896 = auVar856._0_8_;
      uVar884 = (b->y).n[0];
      auVar203._8_8_ = 0;
      auVar203._0_8_ = uVar898;
      auVar617._8_8_ = 0;
      auVar617._0_8_ = uVar884;
      uVar882 = (b->y).n[1];
      auVar204._8_8_ = 0;
      auVar204._0_8_ = uVar905;
      auVar618._8_8_ = 0;
      auVar618._0_8_ = uVar882;
      uVar907 = (b->y).n[2];
      auVar205._8_8_ = 0;
      auVar205._0_8_ = uVar899;
      auVar619._8_8_ = 0;
      auVar619._0_8_ = uVar907;
      uVar883 = (b->y).n[3];
      uVar887 = (b->y).n[4];
      auVar206._8_8_ = 0;
      auVar206._0_8_ = uVar902;
      auVar620._8_8_ = 0;
      auVar620._0_8_ = uVar883;
      auVar207._8_8_ = 0;
      auVar207._0_8_ = uVar891;
      auVar621._8_8_ = 0;
      auVar621._0_8_ = uVar887;
      auVar208._8_8_ = 0;
      auVar208._0_8_ = SUB168(auVar207 * auVar621,0);
      auVar120 = auVar208 * ZEXT816(0x1000003d10) +
                 auVar203 * auVar617 +
                 auVar204 * auVar618 + auVar206 * auVar620 + auVar205 * auVar619;
      auVar209._8_8_ = 0;
      auVar209._0_8_ = uVar891;
      auVar622._8_8_ = 0;
      auVar622._0_8_ = uVar884;
      auVar210._8_8_ = 0;
      auVar210._0_8_ = uVar898;
      auVar623._8_8_ = 0;
      auVar623._0_8_ = uVar882;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = uVar905;
      auVar624._8_8_ = 0;
      auVar624._0_8_ = uVar907;
      auVar212._8_8_ = 0;
      auVar212._0_8_ = uVar899;
      auVar625._8_8_ = 0;
      auVar625._0_8_ = uVar883;
      auVar213._8_8_ = 0;
      auVar213._0_8_ = uVar902;
      auVar626._8_8_ = 0;
      auVar626._0_8_ = uVar887;
      auVar214._8_8_ = 0;
      auVar214._0_8_ = SUB168(auVar207 * auVar621,8);
      auVar122 = auVar214 * ZEXT816(0x1000003d10000) +
                 auVar209 * auVar622 +
                 auVar210 * auVar623 +
                 auVar211 * auVar624 + auVar213 * auVar626 + auVar212 * auVar625 +
                 (auVar120 >> 0x34);
      auVar215._8_8_ = 0;
      auVar215._0_8_ = uVar902;
      auVar627._8_8_ = 0;
      auVar627._0_8_ = uVar884;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = uVar891;
      auVar628._8_8_ = 0;
      auVar628._0_8_ = uVar882;
      auVar217._8_8_ = 0;
      auVar217._0_8_ = uVar898;
      auVar629._8_8_ = 0;
      auVar629._0_8_ = uVar907;
      auVar218._8_8_ = 0;
      auVar218._0_8_ = uVar905;
      auVar630._8_8_ = 0;
      auVar630._0_8_ = uVar883;
      auVar219._8_8_ = 0;
      auVar219._0_8_ = uVar899;
      auVar631._8_8_ = 0;
      auVar631._0_8_ = uVar887;
      auVar124 = (auVar122 >> 0x34) +
                 auVar216 * auVar628 +
                 auVar218 * auVar630 + auVar219 * auVar631 + auVar217 * auVar629;
      uVar893 = auVar124._0_8_;
      uVar906 = auVar124._8_8_;
      auVar857._8_8_ = uVar906 >> 0x34;
      auVar857._0_8_ = uVar906 * 0x1000 | uVar893 >> 0x34;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = uVar893 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar122._6_2_ & 0xf);
      auVar124 = auVar215 * auVar627 + auVar220 * ZEXT816(0x1000003d1);
      uVar893 = auVar124._0_8_;
      uVar906 = auVar124._8_8_;
      auVar221._8_8_ = 0;
      auVar221._0_8_ = uVar899;
      auVar632._8_8_ = 0;
      auVar632._0_8_ = uVar884;
      auVar222._8_8_ = 0;
      auVar222._0_8_ = uVar902;
      auVar633._8_8_ = 0;
      auVar633._0_8_ = uVar882;
      auVar223._8_8_ = 0;
      auVar223._0_8_ = uVar891;
      auVar634._8_8_ = 0;
      auVar634._0_8_ = uVar907;
      auVar858._8_8_ = uVar906 >> 0x34;
      auVar858._0_8_ = uVar906 * 0x1000 | uVar893 >> 0x34;
      auVar224._8_8_ = 0;
      auVar224._0_8_ = uVar898;
      auVar635._8_8_ = 0;
      auVar635._0_8_ = uVar883;
      auVar225._8_8_ = 0;
      auVar225._0_8_ = uVar905;
      auVar636._8_8_ = 0;
      auVar636._0_8_ = uVar887;
      auVar857 = auVar223 * auVar634 + auVar225 * auVar636 + auVar224 * auVar635 + auVar857;
      auVar226._8_8_ = 0;
      auVar226._0_8_ = auVar857._0_8_ & 0xfffffffffffff;
      auVar858 = auVar226 * ZEXT816(0x1000003d10) + auVar222 * auVar633 + auVar221 * auVar632 +
                 auVar858;
      auVar227._8_8_ = 0;
      auVar227._0_8_ = uVar905;
      auVar637._8_8_ = 0;
      auVar637._0_8_ = uVar884;
      auVar228._8_8_ = 0;
      auVar228._0_8_ = uVar899;
      auVar638._8_8_ = 0;
      auVar638._0_8_ = uVar882;
      auVar229._8_8_ = 0;
      auVar229._0_8_ = uVar902;
      auVar639._8_8_ = 0;
      auVar639._0_8_ = uVar907;
      auVar230._8_8_ = 0;
      auVar230._0_8_ = uVar891;
      auVar640._8_8_ = 0;
      auVar640._0_8_ = uVar883;
      auVar231._8_8_ = 0;
      auVar231._0_8_ = uVar898;
      auVar641._8_8_ = 0;
      auVar641._0_8_ = uVar887;
      auVar124 = auVar230 * auVar640 + auVar231 * auVar641 + (auVar857 >> 0x34);
      auVar232._8_8_ = 0;
      auVar232._0_8_ = auVar124._0_8_;
      auVar125 = auVar232 * ZEXT816(0x1000003d10) +
                 auVar229 * auVar639 + auVar228 * auVar638 + auVar227 * auVar637 +
                 (auVar858 >> 0x34);
      auVar126 = auVar125 >> 0x34;
      auVar860._8_8_ = 0;
      auVar860._0_8_ = auVar126._0_8_;
      auVar233._8_8_ = 0;
      auVar233._0_8_ = auVar124._8_8_;
      auVar859._8_8_ = auVar126._8_8_;
      auVar859._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
      auVar860 = auVar233 * ZEXT816(0x1000003d10000) + auVar859 + auVar860;
      uVar882 = auVar860._0_8_;
      uVar893 = uVar893 & 0xfffffffffffff;
      auVar234._8_8_ = 0;
      auVar234._0_8_ = uVar893;
      auVar642._8_8_ = 0;
      auVar642._0_8_ = uVar892;
      uVar883 = (auVar860._8_8_ << 0xc | uVar882 >> 0x34) + (auVar122._0_8_ & 0xffffffffffff);
      uVar907 = auVar858._0_8_ & 0xfffffffffffff;
      auVar235._8_8_ = 0;
      auVar235._0_8_ = uVar907;
      auVar643._8_8_ = 0;
      auVar643._0_8_ = uVar910;
      uVar884 = auVar125._0_8_ & 0xfffffffffffff;
      auVar236._8_8_ = 0;
      auVar236._0_8_ = uVar884;
      auVar644._8_8_ = 0;
      auVar644._0_8_ = uVar890;
      uVar882 = uVar882 & 0xfffffffffffff;
      auVar237._8_8_ = 0;
      auVar237._0_8_ = uVar882;
      auVar645._8_8_ = 0;
      auVar645._0_8_ = uVar894;
      auVar238._8_8_ = 0;
      auVar238._0_8_ = uVar883;
      auVar646._8_8_ = 0;
      auVar646._0_8_ = uVar895;
      auVar239._8_8_ = 0;
      auVar239._0_8_ = SUB168(auVar238 * auVar646,0);
      auVar124 = auVar235 * auVar643 + auVar234 * auVar642 + auVar236 * auVar644 +
                 auVar237 * auVar645 + auVar239 * ZEXT816(0x1000003d10);
      auVar240._8_8_ = 0;
      auVar240._0_8_ = uVar893;
      auVar647._8_8_ = 0;
      auVar647._0_8_ = uVar895;
      auVar241._8_8_ = 0;
      auVar241._0_8_ = uVar907;
      auVar648._8_8_ = 0;
      auVar648._0_8_ = uVar892;
      auVar242._8_8_ = 0;
      auVar242._0_8_ = uVar884;
      auVar649._8_8_ = 0;
      auVar649._0_8_ = uVar910;
      auVar243._8_8_ = 0;
      auVar243._0_8_ = uVar882;
      auVar650._8_8_ = 0;
      auVar650._0_8_ = uVar890;
      auVar244._8_8_ = 0;
      auVar244._0_8_ = uVar894;
      auVar651._8_8_ = 0;
      auVar651._0_8_ = uVar883;
      auVar245._8_8_ = 0;
      auVar245._0_8_ = SUB168(auVar238 * auVar646,8);
      auVar120 = auVar245 * ZEXT816(0x1000003d10000) +
                 auVar244 * auVar651 +
                 auVar243 * auVar650 +
                 auVar242 * auVar649 + auVar240 * auVar647 + auVar241 * auVar648 +
                 (auVar124 >> 0x34);
      auVar246._8_8_ = 0;
      auVar246._0_8_ = uVar893;
      auVar652._8_8_ = 0;
      auVar652._0_8_ = uVar894;
      auVar247._8_8_ = 0;
      auVar247._0_8_ = uVar907;
      auVar653._8_8_ = 0;
      auVar653._0_8_ = uVar895;
      auVar248._8_8_ = 0;
      auVar248._0_8_ = uVar884;
      auVar654._8_8_ = 0;
      auVar654._0_8_ = uVar892;
      auVar249._8_8_ = 0;
      auVar249._0_8_ = uVar882;
      auVar655._8_8_ = 0;
      auVar655._0_8_ = uVar910;
      auVar250._8_8_ = 0;
      auVar250._0_8_ = uVar890;
      auVar656._8_8_ = 0;
      auVar656._0_8_ = uVar883;
      auVar122 = auVar250 * auVar656 +
                 auVar247 * auVar653 + auVar248 * auVar654 + auVar249 * auVar655 +
                 (auVar120 >> 0x34);
      auVar251._8_8_ = 0;
      auVar251._0_8_ = (auVar122._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar120._6_2_ & 0xf);
      auVar125 = auVar246 * auVar652 + auVar251 * ZEXT816(0x1000003d1);
      uVar891 = auVar125._0_8_;
      auVar861._8_8_ = 0;
      auVar861._0_8_ = auVar125._8_8_ * 0x1000 | uVar891 >> 0x34;
      auVar252._8_8_ = 0;
      auVar252._0_8_ = uVar893;
      auVar657._8_8_ = 0;
      auVar657._0_8_ = uVar890;
      auVar253._8_8_ = 0;
      auVar253._0_8_ = uVar907;
      auVar658._8_8_ = 0;
      auVar658._0_8_ = uVar894;
      auVar254._8_8_ = 0;
      auVar254._0_8_ = uVar884;
      auVar659._8_8_ = 0;
      auVar659._0_8_ = uVar895;
      auVar255._8_8_ = 0;
      auVar255._0_8_ = uVar882;
      auVar660._8_8_ = 0;
      auVar660._0_8_ = uVar892;
      auVar256._8_8_ = 0;
      auVar256._0_8_ = uVar910;
      auVar661._8_8_ = 0;
      auVar661._0_8_ = uVar883;
      auVar122 = auVar256 * auVar661 + auVar255 * auVar660 + auVar254 * auVar659 +
                 (auVar122 >> 0x34);
      auVar257._8_8_ = 0;
      auVar257._0_8_ = auVar122._0_8_ & 0xfffffffffffff;
      auVar861 = auVar257 * ZEXT816(0x1000003d10) + auVar252 * auVar657 + auVar253 * auVar658 +
                 auVar861;
      uVar906 = auVar861._0_8_;
      auVar862._8_8_ = 0;
      auVar862._0_8_ = auVar861._8_8_ << 0xc | uVar906 >> 0x34;
      auVar258._8_8_ = 0;
      auVar258._0_8_ = uVar893;
      auVar662._8_8_ = 0;
      auVar662._0_8_ = uVar910;
      auVar259._8_8_ = 0;
      auVar259._0_8_ = uVar907;
      auVar663._8_8_ = 0;
      auVar663._0_8_ = uVar890;
      auVar260._8_8_ = 0;
      auVar260._0_8_ = uVar884;
      auVar664._8_8_ = 0;
      auVar664._0_8_ = uVar894;
      auVar261._8_8_ = 0;
      auVar261._0_8_ = uVar882;
      auVar665._8_8_ = 0;
      auVar665._0_8_ = uVar895;
      auVar262._8_8_ = 0;
      auVar262._0_8_ = uVar892;
      auVar666._8_8_ = 0;
      auVar666._0_8_ = uVar883;
      auVar122 = auVar262 * auVar666 + auVar261 * auVar665 + (auVar122 >> 0x34);
      auVar263._8_8_ = 0;
      auVar263._0_8_ = auVar122._0_8_;
      auVar862 = auVar263 * ZEXT816(0x1000003d10) +
                 auVar260 * auVar664 + auVar258 * auVar662 + auVar259 * auVar663 + auVar862;
      auVar125 = auVar862 >> 0x34;
      auVar864._8_8_ = 0;
      auVar864._0_8_ = auVar125._0_8_;
      auVar264._8_8_ = 0;
      auVar264._0_8_ = auVar122._8_8_;
      auVar863._8_8_ = auVar125._8_8_;
      auVar863._0_8_ = auVar124._0_8_ & 0xfffffffffffff;
      auVar864 = auVar264 * ZEXT816(0x1000003d10000) + auVar863 + auVar864;
      uVar910 = auVar864._0_8_;
      uVar884 = (a->x).n[0];
      uVar899 = ((uVar904 & 0xfffffffffffff) - uVar884) + 0x9ffff5ffffd9d6;
      uVar882 = (a->x).n[1];
      uVar911 = ((auVar827._0_8_ & 0xfffffffffffff) - uVar882) + 0x9ffffffffffff6;
      uVar907 = (a->x).n[2];
      uVar905 = ((auVar123._0_8_ & 0xfffffffffffff) - uVar907) + 0x9ffffffffffff6;
      uVar883 = (a->x).n[3];
      uVar912 = ((uVar896 & 0xfffffffffffff) - uVar883) + 0x9ffffffffffff6;
      uVar887 = (a->x).n[4];
      uVar896 = ((auVar121._0_8_ & 0xffffffffffff) - uVar887) + 0x9fffffffffff6 +
                (auVar856._8_8_ << 0xc | uVar896 >> 0x34);
      uVar892 = (a->y).n[0];
      uVar894 = (a->y).n[1];
      uVar898 = (a->y).n[2];
      uVar902 = (a->y).n[3];
      uVar904 = (a->y).n[4];
      uVar893 = (uVar892 - (uVar891 & 0xfffffffffffff)) + 0x3ffffbfffff0bc;
      uVar890 = (uVar894 - (uVar906 & 0xfffffffffffff)) + 0x3ffffffffffffc;
      uVar895 = (uVar898 - (auVar862._0_8_ & 0xfffffffffffff)) + 0x3ffffffffffffc;
      uVar891 = (uVar902 - (uVar910 & 0xfffffffffffff)) + 0x3ffffffffffffc;
      uVar906 = (uVar904 -
                ((auVar864._8_8_ << 0xc | uVar910 >> 0x34) + (auVar120._0_8_ & 0xffffffffffff))) +
                0x3fffffffffffc;
      local_80.n[0] = uVar893;
      local_80.n[1] = uVar890;
      local_80.n[2] = uVar895;
      local_80.n[3] = uVar891;
      local_80.n[4] = uVar906;
      local_58.n[0] = uVar899;
      local_58.n[1] = uVar911;
      local_58.n[2] = uVar905;
      local_58.n[3] = uVar912;
      local_58.n[4] = uVar896;
      iVar881 = secp256k1_fe_impl_normalizes_to_zero_var(&local_58);
      if (iVar881 == 0) {
        auVar265._8_8_ = 0;
        auVar265._0_8_ = uVar912;
        auVar667._8_8_ = 0;
        auVar667._0_8_ = uVar888;
        auVar266._8_8_ = 0;
        auVar266._0_8_ = uVar905;
        auVar668._8_8_ = 0;
        auVar668._0_8_ = uVar886;
        auVar267._8_8_ = 0;
        auVar267._0_8_ = uVar911;
        auVar669._8_8_ = 0;
        auVar669._0_8_ = uVar901;
        auVar268._8_8_ = 0;
        auVar268._0_8_ = uVar899;
        auVar670._8_8_ = 0;
        auVar670._0_8_ = uVar908;
        auVar269._8_8_ = 0;
        auVar269._0_8_ = uVar896;
        auVar671._8_8_ = 0;
        auVar671._0_8_ = uVar889;
        auVar270._8_8_ = 0;
        auVar270._0_8_ = SUB168(auVar269 * auVar671,0);
        auVar120 = auVar270 * ZEXT816(0x1000003d10) +
                   auVar265 * auVar667 +
                   auVar266 * auVar668 + auVar268 * auVar670 + auVar267 * auVar669;
        auVar271._8_8_ = 0;
        auVar271._0_8_ = uVar896;
        auVar672._8_8_ = 0;
        auVar672._0_8_ = uVar888;
        auVar272._8_8_ = 0;
        auVar272._0_8_ = uVar912;
        auVar673._8_8_ = 0;
        auVar673._0_8_ = uVar886;
        auVar273._8_8_ = 0;
        auVar273._0_8_ = uVar905;
        auVar674._8_8_ = 0;
        auVar674._0_8_ = uVar901;
        auVar274._8_8_ = 0;
        auVar274._0_8_ = uVar911;
        auVar675._8_8_ = 0;
        auVar675._0_8_ = uVar908;
        auVar275._8_8_ = 0;
        auVar275._0_8_ = uVar899;
        auVar676._8_8_ = 0;
        auVar676._0_8_ = uVar889;
        auVar276._8_8_ = 0;
        auVar276._0_8_ = SUB168(auVar269 * auVar671,8);
        auVar121 = auVar276 * ZEXT816(0x1000003d10000) +
                   auVar271 * auVar672 +
                   auVar272 * auVar673 +
                   auVar273 * auVar674 + auVar275 * auVar676 + auVar274 * auVar675 +
                   (auVar120 >> 0x34);
        auVar277._8_8_ = 0;
        auVar277._0_8_ = uVar899;
        auVar677._8_8_ = 0;
        auVar677._0_8_ = uVar888;
        auVar278._8_8_ = 0;
        auVar278._0_8_ = uVar896;
        auVar678._8_8_ = 0;
        auVar678._0_8_ = uVar886;
        auVar279._8_8_ = 0;
        auVar279._0_8_ = uVar912;
        auVar679._8_8_ = 0;
        auVar679._0_8_ = uVar901;
        auVar280._8_8_ = 0;
        auVar280._0_8_ = uVar905;
        auVar680._8_8_ = 0;
        auVar680._0_8_ = uVar908;
        auVar281._8_8_ = 0;
        auVar281._0_8_ = uVar911;
        auVar681._8_8_ = 0;
        auVar681._0_8_ = uVar889;
        auVar122 = auVar279 * auVar679 + auVar281 * auVar681 + auVar280 * auVar680 +
                   auVar278 * auVar678 + (auVar121 >> 0x34);
        auVar282._8_8_ = 0;
        auVar282._0_8_ = (auVar122._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar121._6_2_ & 0xf);
        auVar123 = auVar277 * auVar677 + auVar282 * ZEXT816(0x1000003d1);
        uVar910 = auVar123._0_8_;
        uVar900 = auVar123._8_8_;
        auVar283._8_8_ = 0;
        auVar283._0_8_ = uVar911;
        auVar682._8_8_ = 0;
        auVar682._0_8_ = uVar888;
        auVar284._8_8_ = 0;
        auVar284._0_8_ = uVar899;
        auVar683._8_8_ = 0;
        auVar683._0_8_ = uVar886;
        auVar285._8_8_ = 0;
        auVar285._0_8_ = uVar896;
        auVar684._8_8_ = 0;
        auVar684._0_8_ = uVar901;
        auVar828._8_8_ = uVar900 >> 0x34;
        auVar828._0_8_ = uVar900 * 0x1000 | uVar910 >> 0x34;
        auVar286._8_8_ = 0;
        auVar286._0_8_ = uVar912;
        auVar685._8_8_ = 0;
        auVar685._0_8_ = uVar908;
        auVar287._8_8_ = 0;
        auVar287._0_8_ = uVar905;
        auVar686._8_8_ = 0;
        auVar686._0_8_ = uVar889;
        auVar122 = auVar285 * auVar684 + auVar287 * auVar686 + auVar286 * auVar685 +
                   (auVar122 >> 0x34);
        auVar288._8_8_ = 0;
        auVar288._0_8_ = auVar122._0_8_ & 0xfffffffffffff;
        auVar828 = auVar288 * ZEXT816(0x1000003d10) + auVar283 * auVar682 + auVar284 * auVar683 +
                   auVar828;
        auVar289._8_8_ = 0;
        auVar289._0_8_ = uVar905;
        auVar687._8_8_ = 0;
        auVar687._0_8_ = uVar888;
        auVar290._8_8_ = 0;
        auVar290._0_8_ = uVar911;
        auVar688._8_8_ = 0;
        auVar688._0_8_ = uVar886;
        auVar291._8_8_ = 0;
        auVar291._0_8_ = uVar899;
        auVar689._8_8_ = 0;
        auVar689._0_8_ = uVar901;
        auVar292._8_8_ = 0;
        auVar292._0_8_ = uVar896;
        auVar690._8_8_ = 0;
        auVar690._0_8_ = uVar908;
        auVar293._8_8_ = 0;
        auVar293._0_8_ = uVar912;
        auVar691._8_8_ = 0;
        auVar691._0_8_ = uVar889;
        auVar122 = auVar293 * auVar691 + auVar292 * auVar690 + (auVar122 >> 0x34);
        auVar294._8_8_ = 0;
        auVar294._0_8_ = auVar122._0_8_;
        auVar123 = auVar294 * ZEXT816(0x1000003d10) +
                   auVar291 * auVar689 + auVar290 * auVar688 + auVar289 * auVar687 +
                   (auVar828 >> 0x34);
        auVar124 = auVar123 >> 0x34;
        auVar866._8_8_ = 0;
        auVar866._0_8_ = auVar124._0_8_;
        auVar295._8_8_ = 0;
        auVar295._0_8_ = auVar122._8_8_;
        auVar865._8_8_ = auVar124._8_8_;
        auVar865._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
        auVar866 = auVar295 * ZEXT816(0x1000003d10000) + auVar865 + auVar866;
        uVar897 = auVar866._0_8_;
        uVar888 = uVar899 * 2;
        auVar296._8_8_ = 0;
        auVar296._0_8_ = uVar912;
        auVar692._8_8_ = 0;
        auVar692._0_8_ = uVar888;
        auVar297._8_8_ = 0;
        auVar297._0_8_ = uVar905;
        auVar693._8_8_ = 0;
        auVar693._0_8_ = uVar911 * 2;
        auVar298._8_8_ = 0;
        auVar298._0_8_ = uVar896;
        auVar694._8_8_ = 0;
        auVar694._0_8_ = uVar896;
        auVar299._8_8_ = 0;
        auVar299._0_8_ = SUB168(auVar298 * auVar694,0);
        auVar124 = auVar297 * auVar693 + auVar296 * auVar692 + auVar299 * ZEXT816(0x1000003d10);
        uVar886 = uVar896 * 2;
        auVar300._8_8_ = 0;
        auVar300._0_8_ = uVar886;
        auVar695._8_8_ = 0;
        auVar695._0_8_ = uVar899;
        auVar301._8_8_ = 0;
        auVar301._0_8_ = uVar912;
        auVar696._8_8_ = 0;
        auVar696._0_8_ = uVar911 * 2;
        auVar302._8_8_ = 0;
        auVar302._0_8_ = uVar905;
        auVar697._8_8_ = 0;
        auVar697._0_8_ = uVar905;
        auVar303._8_8_ = 0;
        auVar303._0_8_ = SUB168(auVar298 * auVar694,8);
        auVar120 = auVar303 * ZEXT816(0x1000003d10000) +
                   auVar300 * auVar695 + auVar302 * auVar697 + auVar301 * auVar696 +
                   (auVar124 >> 0x34);
        auVar304._8_8_ = 0;
        auVar304._0_8_ = uVar899;
        auVar698._8_8_ = 0;
        auVar698._0_8_ = uVar899;
        auVar305._8_8_ = 0;
        auVar305._0_8_ = uVar886;
        auVar699._8_8_ = 0;
        auVar699._0_8_ = uVar911;
        auVar306._8_8_ = 0;
        auVar306._0_8_ = uVar912;
        auVar700._8_8_ = 0;
        auVar700._0_8_ = uVar905 * 2;
        auVar122 = auVar306 * auVar700 + auVar305 * auVar699 + (auVar120 >> 0x34);
        auVar307._8_8_ = 0;
        auVar307._0_8_ = (auVar122._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar120._6_2_ & 0xf);
        auVar125 = auVar307 * ZEXT816(0x1000003d1) + auVar304 * auVar698;
        auVar308._8_8_ = 0;
        auVar308._0_8_ = uVar911;
        auVar701._8_8_ = 0;
        auVar701._0_8_ = uVar888;
        auVar309._8_8_ = 0;
        auVar309._0_8_ = uVar886;
        auVar702._8_8_ = 0;
        auVar702._0_8_ = uVar905;
        auVar310._8_8_ = 0;
        auVar310._0_8_ = uVar912;
        auVar703._8_8_ = 0;
        auVar703._0_8_ = uVar912;
        auVar122 = auVar310 * auVar703 + auVar309 * auVar702 + (auVar122 >> 0x34);
        auVar311._8_8_ = 0;
        auVar311._0_8_ = auVar122._0_8_ & 0xfffffffffffff;
        auVar126 = (auVar125 >> 0x34) + auVar311 * ZEXT816(0x1000003d10) + auVar308 * auVar701;
        uVar901 = auVar126._0_8_;
        uVar908 = auVar126._8_8_;
        auVar829._8_8_ = uVar908 >> 0x34;
        auVar829._0_8_ = uVar908 * 0x1000 | uVar901 >> 0x34;
        auVar312._8_8_ = 0;
        auVar312._0_8_ = uVar905;
        auVar704._8_8_ = 0;
        auVar704._0_8_ = uVar888;
        auVar313._8_8_ = 0;
        auVar313._0_8_ = uVar911;
        auVar705._8_8_ = 0;
        auVar705._0_8_ = uVar911;
        auVar314._8_8_ = 0;
        auVar314._0_8_ = uVar886;
        auVar706._8_8_ = 0;
        auVar706._0_8_ = uVar912;
        auVar122 = auVar314 * auVar706 + (auVar122 >> 0x34);
        auVar315._8_8_ = 0;
        auVar315._0_8_ = auVar122._0_8_;
        auVar829 = auVar315 * ZEXT816(0x1000003d10) + auVar313 * auVar705 + auVar312 * auVar704 +
                   auVar829;
        auVar126 = auVar829 >> 0x34;
        auVar868._8_8_ = 0;
        auVar868._0_8_ = auVar126._0_8_;
        auVar316._8_8_ = 0;
        auVar316._0_8_ = auVar122._8_8_;
        auVar867._8_8_ = auVar126._8_8_;
        auVar867._0_8_ = auVar124._0_8_ & 0xffffffffffffe;
        auVar868 = auVar316 * ZEXT816(0x1000003d10000) + auVar867 + auVar868;
        uVar888 = auVar868._0_8_;
        uVar886 = 0x3ffffbfffff0bc - (auVar125._0_8_ & 0xfffffffffffff);
        uVar913 = 0x3ffffffffffffc - (uVar901 & 0xfffffffffffff);
        uVar909 = 0x3ffffffffffffc - (auVar829._0_8_ & 0xfffffffffffff);
        uVar900 = 0x3ffffffffffffc - (uVar888 & 0xfffffffffffff);
        auVar317._8_8_ = 0;
        auVar317._0_8_ = uVar886;
        auVar707._8_8_ = 0;
        auVar707._0_8_ = uVar912;
        uVar903 = 0x3fffffffffffc -
                  ((auVar868._8_8_ << 0xc | uVar888 >> 0x34) + (auVar120._0_8_ & 0xffffffffffff));
        auVar318._8_8_ = 0;
        auVar318._0_8_ = uVar913;
        auVar708._8_8_ = 0;
        auVar708._0_8_ = uVar905;
        auVar319._8_8_ = 0;
        auVar319._0_8_ = uVar909;
        auVar709._8_8_ = 0;
        auVar709._0_8_ = uVar911;
        auVar320._8_8_ = 0;
        auVar320._0_8_ = uVar900;
        auVar710._8_8_ = 0;
        auVar710._0_8_ = uVar899;
        auVar321._8_8_ = 0;
        auVar321._0_8_ = uVar903;
        auVar711._8_8_ = 0;
        auVar711._0_8_ = uVar896;
        auVar322._8_8_ = 0;
        auVar322._0_8_ = SUB168(auVar321 * auVar711,0);
        auVar120 = auVar322 * ZEXT816(0x1000003d10) +
                   auVar318 * auVar708 + auVar317 * auVar707 + auVar319 * auVar709 +
                   auVar320 * auVar710;
        auVar323._8_8_ = 0;
        auVar323._0_8_ = uVar886;
        auVar712._8_8_ = 0;
        auVar712._0_8_ = uVar896;
        auVar324._8_8_ = 0;
        auVar324._0_8_ = uVar913;
        auVar713._8_8_ = 0;
        auVar713._0_8_ = uVar912;
        auVar325._8_8_ = 0;
        auVar325._0_8_ = uVar909;
        auVar714._8_8_ = 0;
        auVar714._0_8_ = uVar905;
        auVar326._8_8_ = 0;
        auVar326._0_8_ = uVar900;
        auVar715._8_8_ = 0;
        auVar715._0_8_ = uVar911;
        auVar327._8_8_ = 0;
        auVar327._0_8_ = uVar903;
        auVar716._8_8_ = 0;
        auVar716._0_8_ = uVar899;
        auVar328._8_8_ = 0;
        auVar328._0_8_ = SUB168(auVar321 * auVar711,8);
        auVar125 = auVar328 * ZEXT816(0x1000003d10000) +
                   auVar327 * auVar716 +
                   auVar326 * auVar715 +
                   auVar325 * auVar714 + auVar323 * auVar712 + auVar324 * auVar713 +
                   (auVar120 >> 0x34);
        auVar329._8_8_ = 0;
        auVar329._0_8_ = uVar886;
        auVar717._8_8_ = 0;
        auVar717._0_8_ = uVar899;
        auVar330._8_8_ = 0;
        auVar330._0_8_ = uVar913;
        auVar718._8_8_ = 0;
        auVar718._0_8_ = uVar896;
        auVar331._8_8_ = 0;
        auVar331._0_8_ = uVar909;
        auVar719._8_8_ = 0;
        auVar719._0_8_ = uVar912;
        auVar332._8_8_ = 0;
        auVar332._0_8_ = uVar900;
        auVar720._8_8_ = 0;
        auVar720._0_8_ = uVar905;
        auVar333._8_8_ = 0;
        auVar333._0_8_ = uVar903;
        auVar721._8_8_ = 0;
        auVar721._0_8_ = uVar911;
        auVar122 = auVar333 * auVar721 +
                   auVar332 * auVar720 + auVar331 * auVar719 + auVar330 * auVar718 +
                   (auVar125 >> 0x34);
        auVar334._8_8_ = 0;
        auVar334._0_8_ = (auVar122._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar125._6_2_ & 0xf);
        auVar124 = auVar329 * auVar717 + auVar334 * ZEXT816(0x1000003d1);
        uVar901 = auVar124._0_8_;
        uVar888 = auVar124._8_8_;
        auVar830._8_8_ = uVar888 >> 0x34;
        auVar830._0_8_ = uVar888 * 0x1000 | uVar901 >> 0x34;
        auVar335._8_8_ = 0;
        auVar335._0_8_ = uVar886;
        auVar722._8_8_ = 0;
        auVar722._0_8_ = uVar911;
        auVar336._8_8_ = 0;
        auVar336._0_8_ = uVar913;
        auVar723._8_8_ = 0;
        auVar723._0_8_ = uVar899;
        uVar901 = uVar901 & 0xfffffffffffff;
        auVar337._8_8_ = 0;
        auVar337._0_8_ = uVar909;
        auVar724._8_8_ = 0;
        auVar724._0_8_ = uVar896;
        auVar338._8_8_ = 0;
        auVar338._0_8_ = uVar900;
        auVar725._8_8_ = 0;
        auVar725._0_8_ = uVar912;
        auVar339._8_8_ = 0;
        auVar339._0_8_ = uVar903;
        auVar726._8_8_ = 0;
        auVar726._0_8_ = uVar905;
        auVar122 = auVar339 * auVar726 + auVar338 * auVar725 + auVar337 * auVar724 +
                   (auVar122 >> 0x34);
        auVar340._8_8_ = 0;
        auVar340._0_8_ = auVar122._0_8_ & 0xfffffffffffff;
        auVar830 = auVar340 * ZEXT816(0x1000003d10) + auVar335 * auVar722 + auVar336 * auVar723 +
                   auVar830;
        auVar341._8_8_ = 0;
        auVar341._0_8_ = uVar886;
        auVar727._8_8_ = 0;
        auVar727._0_8_ = uVar905;
        auVar342._8_8_ = 0;
        auVar342._0_8_ = uVar913;
        auVar728._8_8_ = 0;
        auVar728._0_8_ = uVar911;
        auVar343._8_8_ = 0;
        auVar343._0_8_ = uVar909;
        auVar729._8_8_ = 0;
        auVar729._0_8_ = uVar899;
        uVar899 = auVar830._0_8_ & 0xfffffffffffff;
        auVar344._8_8_ = 0;
        auVar344._0_8_ = uVar900;
        auVar730._8_8_ = 0;
        auVar730._0_8_ = uVar896;
        auVar345._8_8_ = 0;
        auVar345._0_8_ = uVar903;
        auVar731._8_8_ = 0;
        auVar731._0_8_ = uVar912;
        auVar122 = auVar345 * auVar731 + auVar344 * auVar730 + (auVar122 >> 0x34);
        auVar346._8_8_ = 0;
        auVar346._0_8_ = auVar122._0_8_;
        auVar124 = auVar346 * ZEXT816(0x1000003d10) +
                   auVar343 * auVar729 + auVar342 * auVar728 + auVar341 * auVar727 +
                   (auVar830 >> 0x34);
        auVar126 = auVar124 >> 0x34;
        auVar870._8_8_ = 0;
        auVar870._0_8_ = auVar126._0_8_;
        uVar908 = auVar124._0_8_ & 0xfffffffffffff;
        auVar347._8_8_ = 0;
        auVar347._0_8_ = auVar122._8_8_;
        auVar869._8_8_ = auVar126._8_8_;
        auVar869._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
        auVar870 = auVar347 * ZEXT816(0x1000003d10000) + auVar869 + auVar870;
        uVar889 = auVar870._0_8_;
        auVar348._8_8_ = 0;
        auVar348._0_8_ = uVar900;
        auVar732._8_8_ = 0;
        auVar732._0_8_ = uVar884;
        auVar349._8_8_ = 0;
        auVar349._0_8_ = uVar909;
        auVar733._8_8_ = 0;
        auVar733._0_8_ = uVar882;
        auVar350._8_8_ = 0;
        auVar350._0_8_ = uVar913;
        auVar734._8_8_ = 0;
        auVar734._0_8_ = uVar907;
        uVar905 = (auVar870._8_8_ << 0xc | uVar889 >> 0x34) + (auVar125._0_8_ & 0xffffffffffff);
        auVar351._8_8_ = 0;
        auVar351._0_8_ = uVar886;
        auVar735._8_8_ = 0;
        auVar735._0_8_ = uVar883;
        auVar352._8_8_ = 0;
        auVar352._0_8_ = uVar903;
        auVar736._8_8_ = 0;
        auVar736._0_8_ = uVar887;
        auVar353._8_8_ = 0;
        auVar353._0_8_ = SUB168(auVar352 * auVar736,0);
        uVar889 = uVar889 & 0xfffffffffffff;
        auVar120 = auVar353 * ZEXT816(0x1000003d10) +
                   auVar348 * auVar732 +
                   auVar349 * auVar733 + auVar350 * auVar734 + auVar351 * auVar735;
        auVar354._8_8_ = 0;
        auVar354._0_8_ = uVar903;
        auVar737._8_8_ = 0;
        auVar737._0_8_ = uVar884;
        auVar355._8_8_ = 0;
        auVar355._0_8_ = uVar900;
        auVar738._8_8_ = 0;
        auVar738._0_8_ = uVar882;
        auVar356._8_8_ = 0;
        auVar356._0_8_ = uVar909;
        auVar739._8_8_ = 0;
        auVar739._0_8_ = uVar907;
        auVar357._8_8_ = 0;
        auVar357._0_8_ = uVar913;
        auVar740._8_8_ = 0;
        auVar740._0_8_ = uVar883;
        auVar358._8_8_ = 0;
        auVar358._0_8_ = uVar886;
        auVar741._8_8_ = 0;
        auVar741._0_8_ = uVar887;
        auVar359._8_8_ = 0;
        auVar359._0_8_ = SUB168(auVar352 * auVar736,8);
        auVar122 = auVar359 * ZEXT816(0x1000003d10000) +
                   auVar354 * auVar737 +
                   auVar355 * auVar738 +
                   auVar356 * auVar739 + auVar358 * auVar741 + auVar357 * auVar740 +
                   (auVar120 >> 0x34);
        auVar360._8_8_ = 0;
        auVar360._0_8_ = uVar886;
        auVar742._8_8_ = 0;
        auVar742._0_8_ = uVar884;
        auVar361._8_8_ = 0;
        auVar361._0_8_ = uVar903;
        auVar743._8_8_ = 0;
        auVar743._0_8_ = uVar882;
        auVar362._8_8_ = 0;
        auVar362._0_8_ = uVar900;
        auVar744._8_8_ = 0;
        auVar744._0_8_ = uVar907;
        auVar363._8_8_ = 0;
        auVar363._0_8_ = uVar909;
        auVar745._8_8_ = 0;
        auVar745._0_8_ = uVar883;
        auVar364._8_8_ = 0;
        auVar364._0_8_ = uVar913;
        auVar746._8_8_ = 0;
        auVar746._0_8_ = uVar887;
        auVar124 = (auVar122 >> 0x34) +
                   auVar361 * auVar743 +
                   auVar364 * auVar746 + auVar363 * auVar745 + auVar362 * auVar744;
        uVar888 = auVar124._0_8_;
        uVar896 = auVar124._8_8_;
        auVar871._8_8_ = uVar896 >> 0x34;
        auVar871._0_8_ = uVar896 * 0x1000 | uVar888 >> 0x34;
        auVar365._8_8_ = 0;
        auVar365._0_8_ = uVar888 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar122._6_2_ & 0xf);
        auVar124 = auVar360 * auVar742 + auVar365 * ZEXT816(0x1000003d1);
        uVar896 = auVar124._0_8_;
        uVar888 = auVar124._8_8_;
        auVar831._8_8_ = uVar888 >> 0x34;
        auVar831._0_8_ = uVar888 * 0x1000 | uVar896 >> 0x34;
        auVar366._8_8_ = 0;
        auVar366._0_8_ = uVar913;
        auVar747._8_8_ = 0;
        auVar747._0_8_ = uVar884;
        auVar367._8_8_ = 0;
        auVar367._0_8_ = uVar886;
        auVar748._8_8_ = 0;
        auVar748._0_8_ = uVar882;
        auVar368._8_8_ = 0;
        auVar368._0_8_ = uVar903;
        auVar749._8_8_ = 0;
        auVar749._0_8_ = uVar907;
        uVar896 = uVar896 & 0xfffffffffffff;
        auVar369._8_8_ = 0;
        auVar369._0_8_ = uVar900;
        auVar750._8_8_ = 0;
        auVar750._0_8_ = uVar883;
        auVar370._8_8_ = 0;
        auVar370._0_8_ = uVar909;
        auVar751._8_8_ = 0;
        auVar751._0_8_ = uVar887;
        auVar871 = auVar368 * auVar749 + auVar370 * auVar751 + auVar369 * auVar750 + auVar871;
        auVar371._8_8_ = 0;
        auVar371._0_8_ = auVar871._0_8_ & 0xfffffffffffff;
        auVar831 = auVar371 * ZEXT816(0x1000003d10) + auVar366 * auVar747 + auVar367 * auVar748 +
                   auVar831;
        auVar372._8_8_ = 0;
        auVar372._0_8_ = uVar909;
        auVar752._8_8_ = 0;
        auVar752._0_8_ = uVar884;
        auVar373._8_8_ = 0;
        auVar373._0_8_ = uVar913;
        auVar753._8_8_ = 0;
        auVar753._0_8_ = uVar882;
        auVar374._8_8_ = 0;
        auVar374._0_8_ = uVar886;
        auVar754._8_8_ = 0;
        auVar754._0_8_ = uVar907;
        uVar911 = auVar831._0_8_ & 0xfffffffffffff;
        auVar375._8_8_ = 0;
        auVar375._0_8_ = uVar903;
        auVar755._8_8_ = 0;
        auVar755._0_8_ = uVar883;
        auVar376._8_8_ = 0;
        auVar376._0_8_ = uVar900;
        auVar756._8_8_ = 0;
        auVar756._0_8_ = uVar887;
        auVar124 = auVar376 * auVar756 + auVar375 * auVar755 + (auVar871 >> 0x34);
        auVar377._8_8_ = 0;
        auVar377._0_8_ = auVar124._0_8_;
        auVar125 = auVar377 * ZEXT816(0x1000003d10) +
                   auVar372 * auVar752 + auVar374 * auVar754 + auVar373 * auVar753 +
                   (auVar831 >> 0x34);
        auVar126 = auVar125 >> 0x34;
        auVar873._8_8_ = 0;
        auVar873._0_8_ = auVar126._0_8_;
        uVar884 = auVar125._0_8_ & 0xfffffffffffff;
        auVar378._8_8_ = 0;
        auVar378._0_8_ = auVar124._8_8_;
        auVar872._8_8_ = auVar126._8_8_;
        auVar872._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
        auVar873 = auVar378 * ZEXT816(0x1000003d10000) + auVar872 + auVar873;
        uVar882 = auVar873._0_8_;
        lVar885 = (auVar873._8_8_ << 0xc | uVar882 >> 0x34) + (auVar122._0_8_ & 0xffffffffffff);
        uVar882 = uVar882 & 0xfffffffffffff;
        uVar888 = uVar893 * 2;
        auVar379._8_8_ = 0;
        auVar379._0_8_ = uVar891;
        auVar757._8_8_ = 0;
        auVar757._0_8_ = uVar888;
        auVar380._8_8_ = 0;
        auVar380._0_8_ = uVar895;
        auVar758._8_8_ = 0;
        auVar758._0_8_ = uVar890 * 2;
        auVar381._8_8_ = 0;
        auVar381._0_8_ = uVar906;
        auVar759._8_8_ = 0;
        auVar759._0_8_ = uVar906;
        auVar382._8_8_ = 0;
        auVar382._0_8_ = SUB168(auVar381 * auVar759,0);
        auVar124 = auVar380 * auVar758 + auVar379 * auVar757 + auVar382 * ZEXT816(0x1000003d10);
        uVar886 = uVar906 * 2;
        auVar383._8_8_ = 0;
        auVar383._0_8_ = uVar886;
        auVar760._8_8_ = 0;
        auVar760._0_8_ = uVar893;
        auVar384._8_8_ = 0;
        auVar384._0_8_ = uVar891;
        auVar761._8_8_ = 0;
        auVar761._0_8_ = uVar890 * 2;
        auVar385._8_8_ = 0;
        auVar385._0_8_ = uVar895;
        auVar762._8_8_ = 0;
        auVar762._0_8_ = uVar895;
        auVar386._8_8_ = 0;
        auVar386._0_8_ = SUB168(auVar381 * auVar759,8);
        auVar120 = auVar386 * ZEXT816(0x1000003d10000) +
                   auVar383 * auVar760 + auVar385 * auVar762 + auVar384 * auVar761 +
                   (auVar124 >> 0x34);
        auVar387._8_8_ = 0;
        auVar387._0_8_ = uVar893;
        auVar763._8_8_ = 0;
        auVar763._0_8_ = uVar893;
        auVar388._8_8_ = 0;
        auVar388._0_8_ = uVar886;
        auVar764._8_8_ = 0;
        auVar764._0_8_ = uVar890;
        auVar389._8_8_ = 0;
        auVar389._0_8_ = uVar891;
        auVar765._8_8_ = 0;
        auVar765._0_8_ = uVar895 * 2;
        auVar122 = auVar389 * auVar765 + auVar388 * auVar764 + (auVar120 >> 0x34);
        auVar390._8_8_ = 0;
        auVar390._0_8_ = (auVar122._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar120._6_2_ & 0xf);
        auVar125 = auVar387 * auVar763 + auVar390 * ZEXT816(0x1000003d1);
        uVar883 = auVar125._0_8_;
        uVar907 = auVar125._8_8_;
        auVar880._8_8_ = uVar907 >> 0x34;
        auVar880._0_8_ = uVar907 * 0x1000 | uVar883 >> 0x34;
        auVar391._8_8_ = 0;
        auVar391._0_8_ = uVar890;
        auVar766._8_8_ = 0;
        auVar766._0_8_ = uVar888;
        auVar392._8_8_ = 0;
        auVar392._0_8_ = uVar886;
        auVar767._8_8_ = 0;
        auVar767._0_8_ = uVar895;
        auVar393._8_8_ = 0;
        auVar393._0_8_ = uVar891;
        auVar768._8_8_ = 0;
        auVar768._0_8_ = uVar891;
        auVar122 = auVar393 * auVar768 + auVar392 * auVar767 + (auVar122 >> 0x34);
        auVar394._8_8_ = 0;
        auVar394._0_8_ = auVar122._0_8_ & 0xfffffffffffff;
        auVar880 = auVar391 * auVar766 + auVar394 * ZEXT816(0x1000003d10) + auVar880;
        uVar907 = auVar880._0_8_;
        uVar887 = auVar880._8_8_;
        auVar832._8_8_ = uVar887 >> 0x34;
        auVar832._0_8_ = uVar887 * 0x1000 | uVar907 >> 0x34;
        auVar395._8_8_ = 0;
        auVar395._0_8_ = uVar895;
        auVar769._8_8_ = 0;
        auVar769._0_8_ = uVar888;
        auVar396._8_8_ = 0;
        auVar396._0_8_ = uVar890;
        auVar770._8_8_ = 0;
        auVar770._0_8_ = uVar890;
        auVar397._8_8_ = 0;
        auVar397._0_8_ = uVar886;
        auVar771._8_8_ = 0;
        auVar771._0_8_ = uVar891;
        auVar122 = auVar397 * auVar771 + (auVar122 >> 0x34);
        auVar398._8_8_ = 0;
        auVar398._0_8_ = auVar122._0_8_;
        auVar832 = auVar398 * ZEXT816(0x1000003d10) + auVar396 * auVar770 + auVar395 * auVar769 +
                   auVar832;
        auVar125 = auVar832 >> 0x34;
        auVar874._8_8_ = auVar125._8_8_;
        auVar874._0_8_ = auVar124._0_8_ & 0xffffffffffffe;
        auVar875._8_8_ = 0;
        auVar875._0_8_ = auVar125._0_8_;
        auVar399._8_8_ = 0;
        auVar399._0_8_ = auVar122._8_8_;
        auVar875 = auVar399 * ZEXT816(0x1000003d10000) + auVar874 + auVar875;
        uVar888 = auVar875._0_8_;
        uVar1 = (uVar883 & 0xfffffffffffff) + uVar901 + uVar896 * 2;
        uVar2 = (uVar907 & 0xfffffffffffff) + uVar899 + uVar911 * 2;
        uVar3 = (auVar832._0_8_ & 0xfffffffffffff) + uVar908 + uVar884 * 2;
        uVar4 = (uVar888 & 0xfffffffffffff) + uVar889 + uVar882 * 2;
        uVar5 = (auVar875._8_8_ << 0xc | uVar888 >> 0x34) + (auVar120._0_8_ & 0xffffffffffff) +
                uVar905 + lVar885 * 2;
        uVar896 = uVar896 + uVar1;
        uVar911 = uVar911 + uVar2;
        uVar884 = uVar884 + uVar3;
        uVar882 = uVar882 + uVar4;
        auVar400._8_8_ = 0;
        auVar400._0_8_ = uVar896;
        auVar772._8_8_ = 0;
        auVar772._0_8_ = uVar891;
        uVar886 = lVar885 + uVar5;
        auVar401._8_8_ = 0;
        auVar401._0_8_ = uVar911;
        auVar773._8_8_ = 0;
        auVar773._0_8_ = uVar895;
        auVar402._8_8_ = 0;
        auVar402._0_8_ = uVar884;
        auVar774._8_8_ = 0;
        auVar774._0_8_ = uVar890;
        auVar403._8_8_ = 0;
        auVar403._0_8_ = uVar882;
        auVar775._8_8_ = 0;
        auVar775._0_8_ = uVar893;
        auVar404._8_8_ = 0;
        auVar404._0_8_ = uVar886;
        auVar776._8_8_ = 0;
        auVar776._0_8_ = uVar906;
        auVar405._8_8_ = 0;
        auVar405._0_8_ = SUB168(auVar404 * auVar776,0);
        auVar125 = auVar401 * auVar773 + auVar400 * auVar772 + auVar402 * auVar774 +
                   auVar403 * auVar775 + auVar405 * ZEXT816(0x1000003d10);
        auVar406._8_8_ = 0;
        auVar406._0_8_ = uVar896;
        auVar777._8_8_ = 0;
        auVar777._0_8_ = uVar906;
        auVar407._8_8_ = 0;
        auVar407._0_8_ = uVar911;
        auVar778._8_8_ = 0;
        auVar778._0_8_ = uVar891;
        auVar408._8_8_ = 0;
        auVar408._0_8_ = uVar884;
        auVar779._8_8_ = 0;
        auVar779._0_8_ = uVar895;
        auVar409._8_8_ = 0;
        auVar409._0_8_ = uVar882;
        auVar780._8_8_ = 0;
        auVar780._0_8_ = uVar890;
        auVar410._8_8_ = 0;
        auVar410._0_8_ = uVar886;
        auVar781._8_8_ = 0;
        auVar781._0_8_ = uVar893;
        auVar411._8_8_ = 0;
        auVar411._0_8_ = SUB168(auVar404 * auVar776,8);
        auVar120 = auVar411 * ZEXT816(0x1000003d10000) +
                   auVar410 * auVar781 +
                   auVar409 * auVar780 +
                   auVar408 * auVar779 + auVar407 * auVar778 + auVar406 * auVar777 +
                   (auVar125 >> 0x34);
        auVar412._8_8_ = 0;
        auVar412._0_8_ = uVar896;
        auVar782._8_8_ = 0;
        auVar782._0_8_ = uVar893;
        auVar413._8_8_ = 0;
        auVar413._0_8_ = uVar911;
        auVar783._8_8_ = 0;
        auVar783._0_8_ = uVar906;
        auVar414._8_8_ = 0;
        auVar414._0_8_ = uVar884;
        auVar784._8_8_ = 0;
        auVar784._0_8_ = uVar891;
        auVar415._8_8_ = 0;
        auVar415._0_8_ = uVar882;
        auVar785._8_8_ = 0;
        auVar785._0_8_ = uVar895;
        auVar416._8_8_ = 0;
        auVar416._0_8_ = uVar886;
        auVar786._8_8_ = 0;
        auVar786._0_8_ = uVar890;
        auVar122 = auVar416 * auVar786 +
                   auVar415 * auVar785 + auVar414 * auVar784 + auVar413 * auVar783 +
                   (auVar120 >> 0x34);
        auVar417._8_8_ = 0;
        auVar417._0_8_ = (auVar122._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar120._6_2_ & 0xf);
        auVar124 = auVar412 * auVar782 + auVar417 * ZEXT816(0x1000003d1);
        uVar888 = auVar124._0_8_;
        uVar907 = auVar124._8_8_;
        auVar833._8_8_ = uVar907 >> 0x34;
        auVar833._0_8_ = uVar907 * 0x1000 | uVar888 >> 0x34;
        auVar418._8_8_ = 0;
        auVar418._0_8_ = uVar896;
        auVar787._8_8_ = 0;
        auVar787._0_8_ = uVar890;
        auVar419._8_8_ = 0;
        auVar419._0_8_ = uVar911;
        auVar788._8_8_ = 0;
        auVar788._0_8_ = uVar893;
        auVar420._8_8_ = 0;
        auVar420._0_8_ = uVar884;
        auVar789._8_8_ = 0;
        auVar789._0_8_ = uVar906;
        auVar421._8_8_ = 0;
        auVar421._0_8_ = uVar882;
        auVar790._8_8_ = 0;
        auVar790._0_8_ = uVar891;
        auVar422._8_8_ = 0;
        auVar422._0_8_ = uVar886;
        auVar791._8_8_ = 0;
        auVar791._0_8_ = uVar895;
        auVar122 = auVar422 * auVar791 + auVar421 * auVar790 + auVar420 * auVar789 +
                   (auVar122 >> 0x34);
        auVar423._8_8_ = 0;
        auVar423._0_8_ = auVar122._0_8_ & 0xfffffffffffff;
        auVar833 = auVar423 * ZEXT816(0x1000003d10) + auVar418 * auVar787 + auVar419 * auVar788 +
                   auVar833;
        auVar424._8_8_ = 0;
        auVar424._0_8_ = uVar896;
        auVar792._8_8_ = 0;
        auVar792._0_8_ = uVar895;
        auVar425._8_8_ = 0;
        auVar425._0_8_ = uVar911;
        auVar793._8_8_ = 0;
        auVar793._0_8_ = uVar890;
        auVar426._8_8_ = 0;
        auVar426._0_8_ = uVar884;
        auVar794._8_8_ = 0;
        auVar794._0_8_ = uVar893;
        auVar427._8_8_ = 0;
        auVar427._0_8_ = uVar882;
        auVar795._8_8_ = 0;
        auVar795._0_8_ = uVar906;
        auVar428._8_8_ = 0;
        auVar428._0_8_ = uVar886;
        auVar796._8_8_ = 0;
        auVar796._0_8_ = uVar891;
        auVar122 = auVar427 * auVar795 + auVar428 * auVar796 + (auVar122 >> 0x34);
        auVar429._8_8_ = 0;
        auVar429._0_8_ = auVar122._0_8_;
        auVar124 = auVar429 * ZEXT816(0x1000003d10) +
                   auVar426 * auVar794 + auVar425 * auVar793 + auVar424 * auVar792 +
                   (auVar833 >> 0x34);
        auVar126 = auVar124 >> 0x34;
        auVar877._8_8_ = 0;
        auVar877._0_8_ = auVar126._0_8_;
        auVar430._8_8_ = 0;
        auVar430._0_8_ = auVar122._8_8_;
        auVar876._8_8_ = auVar126._8_8_;
        auVar876._0_8_ = auVar125._0_8_ & 0xfffffffffffff;
        auVar877 = auVar430 * ZEXT816(0x1000003d10000) + auVar876 + auVar877;
        uVar886 = auVar877._0_8_;
        auVar431._8_8_ = 0;
        auVar431._0_8_ = uVar901;
        auVar797._8_8_ = 0;
        auVar797._0_8_ = uVar902;
        auVar432._8_8_ = 0;
        auVar432._0_8_ = uVar899;
        auVar798._8_8_ = 0;
        auVar798._0_8_ = uVar898;
        auVar433._8_8_ = 0;
        auVar433._0_8_ = uVar908;
        auVar799._8_8_ = 0;
        auVar799._0_8_ = uVar894;
        auVar434._8_8_ = 0;
        auVar434._0_8_ = uVar889;
        auVar800._8_8_ = 0;
        auVar800._0_8_ = uVar892;
        auVar435._8_8_ = 0;
        auVar435._0_8_ = uVar905;
        auVar801._8_8_ = 0;
        auVar801._0_8_ = uVar904;
        auVar436._8_8_ = 0;
        auVar436._0_8_ = SUB168(auVar435 * auVar801,0);
        auVar125 = auVar432 * auVar798 + auVar431 * auVar797 + auVar433 * auVar799 +
                   auVar434 * auVar800 + auVar436 * ZEXT816(0x1000003d10);
        auVar437._8_8_ = 0;
        auVar437._0_8_ = uVar901;
        auVar802._8_8_ = 0;
        auVar802._0_8_ = uVar904;
        auVar438._8_8_ = 0;
        auVar438._0_8_ = uVar899;
        auVar803._8_8_ = 0;
        auVar803._0_8_ = uVar902;
        auVar439._8_8_ = 0;
        auVar439._0_8_ = uVar908;
        auVar804._8_8_ = 0;
        auVar804._0_8_ = uVar898;
        auVar440._8_8_ = 0;
        auVar440._0_8_ = uVar889;
        auVar805._8_8_ = 0;
        auVar805._0_8_ = uVar894;
        auVar441._8_8_ = 0;
        auVar441._0_8_ = uVar905;
        auVar806._8_8_ = 0;
        auVar806._0_8_ = uVar892;
        auVar442._8_8_ = 0;
        auVar442._0_8_ = SUB168(auVar435 * auVar801,8);
        r->infinity = 0;
        (r->z).n[0] = uVar910 & 0xfffffffffffff;
        auVar122 = auVar442 * ZEXT816(0x1000003d10000) +
                   auVar441 * auVar806 +
                   auVar440 * auVar805 +
                   auVar439 * auVar804 + auVar437 * auVar802 + auVar438 * auVar803 +
                   (auVar125 >> 0x34);
        (r->z).n[1] = auVar828._0_8_ & 0xfffffffffffff;
        (r->z).n[2] = auVar123._0_8_ & 0xfffffffffffff;
        auVar443._8_8_ = 0;
        auVar443._0_8_ = uVar901;
        auVar807._8_8_ = 0;
        auVar807._0_8_ = uVar892;
        auVar444._8_8_ = 0;
        auVar444._0_8_ = uVar899;
        auVar808._8_8_ = 0;
        auVar808._0_8_ = uVar904;
        auVar445._8_8_ = 0;
        auVar445._0_8_ = uVar908;
        auVar809._8_8_ = 0;
        auVar809._0_8_ = uVar902;
        auVar446._8_8_ = 0;
        auVar446._0_8_ = uVar889;
        auVar810._8_8_ = 0;
        auVar810._0_8_ = uVar898;
        auVar447._8_8_ = 0;
        auVar447._0_8_ = uVar905;
        auVar811._8_8_ = 0;
        auVar811._0_8_ = uVar894;
        (r->z).n[3] = uVar897 & 0xfffffffffffff;
        auVar123 = auVar447 * auVar811 +
                   auVar446 * auVar810 + auVar445 * auVar809 + auVar444 * auVar808 +
                   (auVar122 >> 0x34);
        (r->z).n[4] = (auVar866._8_8_ << 0xc | uVar897 >> 0x34) + (auVar121._0_8_ & 0xffffffffffff);
        auVar448._8_8_ = 0;
        auVar448._0_8_ = (auVar123._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar122._6_2_ & 0xf);
        auVar121 = auVar443 * auVar807 + auVar448 * ZEXT816(0x1000003d1);
        uVar907 = auVar121._0_8_;
        uVar884 = auVar121._8_8_;
        auVar834._8_8_ = uVar884 >> 0x34;
        auVar834._0_8_ = uVar884 * 0x1000 | uVar907 >> 0x34;
        auVar449._8_8_ = 0;
        auVar449._0_8_ = uVar901;
        auVar812._8_8_ = 0;
        auVar812._0_8_ = uVar894;
        auVar450._8_8_ = 0;
        auVar450._0_8_ = uVar899;
        auVar813._8_8_ = 0;
        auVar813._0_8_ = uVar892;
        auVar451._8_8_ = 0;
        auVar451._0_8_ = uVar908;
        auVar814._8_8_ = 0;
        auVar814._0_8_ = uVar904;
        auVar452._8_8_ = 0;
        auVar452._0_8_ = uVar889;
        auVar815._8_8_ = 0;
        auVar815._0_8_ = uVar902;
        auVar453._8_8_ = 0;
        auVar453._0_8_ = uVar905;
        auVar816._8_8_ = 0;
        auVar816._0_8_ = uVar898;
        auVar121 = (auVar123 >> 0x34) +
                   auVar453 * auVar816 + auVar452 * auVar815 + auVar451 * auVar814;
        uVar882 = auVar121._0_8_;
        uVar884 = auVar121._8_8_;
        auVar454._8_8_ = 0;
        auVar454._0_8_ = uVar882 & 0xfffffffffffff;
        auVar834 = auVar454 * ZEXT816(0x1000003d10) + auVar449 * auVar812 + auVar450 * auVar813 +
                   auVar834;
        auVar835._8_8_ = uVar884 >> 0x34;
        auVar835._0_8_ = uVar884 * 0x1000 | uVar882 >> 0x34;
        auVar455._8_8_ = 0;
        auVar455._0_8_ = uVar901;
        auVar817._8_8_ = 0;
        auVar817._0_8_ = uVar898;
        auVar456._8_8_ = 0;
        auVar456._0_8_ = uVar899;
        auVar818._8_8_ = 0;
        auVar818._0_8_ = uVar894;
        auVar457._8_8_ = 0;
        auVar457._0_8_ = uVar908;
        auVar819._8_8_ = 0;
        auVar819._0_8_ = uVar892;
        auVar458._8_8_ = 0;
        auVar458._0_8_ = uVar889;
        auVar820._8_8_ = 0;
        auVar820._0_8_ = uVar904;
        auVar459._8_8_ = 0;
        auVar459._0_8_ = uVar905;
        auVar821._8_8_ = 0;
        auVar821._0_8_ = uVar902;
        (r->x).n[0] = uVar1;
        auVar835 = auVar459 * auVar821 + auVar458 * auVar820 + auVar835;
        (r->x).n[1] = uVar2;
        auVar460._8_8_ = 0;
        auVar460._0_8_ = auVar835._0_8_;
        (r->x).n[2] = uVar3;
        (r->x).n[3] = uVar4;
        auVar121 = auVar460 * ZEXT816(0x1000003d10) +
                   auVar457 * auVar819 + auVar455 * auVar817 + auVar456 * auVar818 +
                   (auVar834 >> 0x34);
        (r->x).n[4] = uVar5;
        auVar123 = auVar121 >> 0x34;
        auVar879._8_8_ = 0;
        auVar879._0_8_ = auVar123._0_8_;
        auVar461._8_8_ = 0;
        auVar461._0_8_ = auVar835._8_8_;
        auVar878._8_8_ = auVar123._8_8_;
        auVar878._0_8_ = auVar125._0_8_ & 0xfffffffffffff;
        auVar879 = auVar461 * ZEXT816(0x1000003d10000) + auVar878 + auVar879;
        uVar901 = auVar879._0_8_;
        (r->y).n[0] = (uVar907 & 0xfffffffffffff) + (uVar888 & 0xfffffffffffff);
        (r->y).n[1] = (auVar834._0_8_ & 0xfffffffffffff) + (auVar833._0_8_ & 0xfffffffffffff);
        (r->y).n[2] = (auVar121._0_8_ & 0xfffffffffffff) + (auVar124._0_8_ & 0xfffffffffffff);
        (r->y).n[3] = (uVar901 & 0xfffffffffffff) + (uVar886 & 0xfffffffffffff);
        (r->y).n[4] = (auVar879._8_8_ << 0xc | uVar901 >> 0x34) + (auVar122._0_8_ & 0xffffffffffff)
                      + (auVar877._8_8_ << 0xc | uVar886 >> 0x34) +
                        (auVar120._0_8_ & 0xffffffffffff);
      }
      else {
        iVar881 = secp256k1_fe_impl_normalizes_to_zero_var(&local_80);
        if (iVar881 != 0) {
          secp256k1_gej_double(r,a);
          return;
        }
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        (r->x).n[4] = 0;
        (r->y).n[0] = 0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
      }
    }
    else {
      for (lVar885 = 0x10; lVar885 != 0; lVar885 = lVar885 + -1) {
        (r->x).n[0] = (a->x).n[0];
        a = (secp256k1_gej *)((a->x).n + 1);
        r = (secp256k1_gej *)((r->x).n + 1);
      }
    }
  }
  else {
    r->infinity = b->infinity;
    uVar888 = bzinv->n[0];
    uVar886 = bzinv->n[1];
    uVar901 = bzinv->n[3];
    uVar882 = uVar888 * 2;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar901;
    auVar462._8_8_ = 0;
    auVar462._0_8_ = uVar882;
    uVar908 = bzinv->n[2];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar908;
    auVar463._8_8_ = 0;
    auVar463._0_8_ = uVar886 * 2;
    uVar884 = bzinv->n[4];
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar884;
    auVar464._8_8_ = 0;
    auVar464._0_8_ = uVar884;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SUB168(auVar8 * auVar464,0);
    auVar120 = auVar6 * auVar462 + auVar7 * auVar463 + auVar9 * ZEXT816(0x1000003d10);
    uVar889 = uVar884 * 2;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar889;
    auVar465._8_8_ = 0;
    auVar465._0_8_ = uVar888;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar901;
    auVar466._8_8_ = 0;
    auVar466._0_8_ = uVar886 * 2;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar908;
    auVar467._8_8_ = 0;
    auVar467._0_8_ = uVar908;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SUB168(auVar8 * auVar464,8);
    auVar123 = auVar13 * ZEXT816(0x1000003d10000) +
               auVar10 * auVar465 + auVar12 * auVar467 + auVar11 * auVar466 + (auVar120 >> 0x34);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar888;
    auVar468._8_8_ = 0;
    auVar468._0_8_ = uVar888;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar889;
    auVar469._8_8_ = 0;
    auVar469._0_8_ = uVar886;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar901;
    auVar470._8_8_ = 0;
    auVar470._0_8_ = uVar908 * 2;
    auVar121 = auVar16 * auVar470 + auVar15 * auVar469 + (auVar123 >> 0x34);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (auVar121._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar123._6_2_ & 0xf);
    auVar122 = auVar17 * ZEXT816(0x1000003d1) + auVar14 * auVar468;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar886;
    auVar471._8_8_ = 0;
    auVar471._0_8_ = uVar882;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar889;
    auVar472._8_8_ = 0;
    auVar472._0_8_ = uVar908;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar901;
    auVar473._8_8_ = 0;
    auVar473._0_8_ = uVar901;
    auVar121 = auVar20 * auVar473 + auVar19 * auVar472 + (auVar121 >> 0x34);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auVar121._0_8_ & 0xfffffffffffff;
    auVar124 = (auVar122 >> 0x34) + auVar18 * auVar471 + auVar21 * ZEXT816(0x1000003d10);
    uVar892 = auVar124._0_8_;
    uVar907 = auVar124._8_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar908;
    auVar474._8_8_ = 0;
    auVar474._0_8_ = uVar882;
    auVar836._8_8_ = uVar907 >> 0x34;
    auVar836._0_8_ = uVar907 * 0x1000 | uVar892 >> 0x34;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar886;
    auVar475._8_8_ = 0;
    auVar475._0_8_ = uVar886;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar889;
    auVar476._8_8_ = 0;
    auVar476._0_8_ = uVar901;
    auVar121 = auVar24 * auVar476 + (auVar121 >> 0x34);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auVar121._0_8_;
    auVar836 = auVar25 * ZEXT816(0x1000003d10) + auVar23 * auVar475 + auVar22 * auVar474 + auVar836;
    auVar124 = auVar836 >> 0x34;
    auVar837._8_8_ = auVar124._8_8_;
    auVar837._0_8_ = auVar120._0_8_ & 0xffffffffffffe;
    auVar838._8_8_ = 0;
    auVar838._0_8_ = auVar124._0_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auVar121._8_8_;
    auVar838 = auVar26 * ZEXT816(0x1000003d10000) + auVar837 + auVar838;
    uVar898 = auVar838._0_8_;
    uVar882 = auVar122._0_8_ & 0xfffffffffffff;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar882;
    auVar477._8_8_ = 0;
    auVar477._0_8_ = uVar901;
    uVar902 = (auVar838._8_8_ << 0xc | uVar898 >> 0x34) + (auVar123._0_8_ & 0xffffffffffff);
    uVar892 = uVar892 & 0xfffffffffffff;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar892;
    auVar478._8_8_ = 0;
    auVar478._0_8_ = uVar908;
    uVar887 = auVar836._0_8_ & 0xfffffffffffff;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar887;
    auVar479._8_8_ = 0;
    auVar479._0_8_ = uVar886;
    uVar898 = uVar898 & 0xfffffffffffff;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar898;
    auVar480._8_8_ = 0;
    auVar480._0_8_ = uVar888;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar902;
    auVar481._8_8_ = 0;
    auVar481._0_8_ = uVar884;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = SUB168(auVar31 * auVar481,0);
    auVar120 = auVar32 * ZEXT816(0x1000003d10) +
               auVar28 * auVar478 + auVar27 * auVar477 + auVar29 * auVar479 + auVar30 * auVar480;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar882;
    auVar482._8_8_ = 0;
    auVar482._0_8_ = uVar884;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar892;
    auVar483._8_8_ = 0;
    auVar483._0_8_ = uVar901;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar887;
    auVar484._8_8_ = 0;
    auVar484._0_8_ = uVar908;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar898;
    auVar485._8_8_ = 0;
    auVar485._0_8_ = uVar886;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar902;
    auVar486._8_8_ = 0;
    auVar486._0_8_ = uVar888;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = SUB168(auVar31 * auVar481,8);
    auVar123 = auVar38 * ZEXT816(0x1000003d10000) +
               auVar37 * auVar486 +
               auVar36 * auVar485 + auVar35 * auVar484 + auVar33 * auVar482 + auVar34 * auVar483 +
               (auVar120 >> 0x34);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar882;
    auVar487._8_8_ = 0;
    auVar487._0_8_ = uVar888;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar892;
    auVar488._8_8_ = 0;
    auVar488._0_8_ = uVar884;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar887;
    auVar489._8_8_ = 0;
    auVar489._0_8_ = uVar901;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar898;
    auVar490._8_8_ = 0;
    auVar490._0_8_ = uVar908;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar902;
    auVar491._8_8_ = 0;
    auVar491._0_8_ = uVar886;
    auVar121 = auVar43 * auVar491 + auVar42 * auVar490 + auVar41 * auVar489 + auVar40 * auVar488 +
               (auVar123 >> 0x34);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = (auVar121._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar123._6_2_ & 0xf);
    auVar122 = auVar39 * auVar487 + auVar44 * ZEXT816(0x1000003d1);
    uVar883 = auVar122._0_8_;
    uVar889 = auVar122._8_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar882;
    auVar492._8_8_ = 0;
    auVar492._0_8_ = uVar886;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar892;
    auVar493._8_8_ = 0;
    auVar493._0_8_ = uVar888;
    auVar822._8_8_ = uVar889 >> 0x34;
    auVar822._0_8_ = uVar889 * 0x1000 | uVar883 >> 0x34;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar887;
    auVar494._8_8_ = 0;
    auVar494._0_8_ = uVar884;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar898;
    auVar495._8_8_ = 0;
    auVar495._0_8_ = uVar901;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar902;
    auVar496._8_8_ = 0;
    auVar496._0_8_ = uVar908;
    auVar121 = auVar49 * auVar496 + auVar48 * auVar495 + auVar47 * auVar494 + (auVar121 >> 0x34);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = auVar121._0_8_ & 0xfffffffffffff;
    auVar822 = auVar50 * ZEXT816(0x1000003d10) + auVar45 * auVar492 + auVar46 * auVar493 + auVar822;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar882;
    auVar497._8_8_ = 0;
    auVar497._0_8_ = uVar908;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar892;
    auVar498._8_8_ = 0;
    auVar498._0_8_ = uVar886;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar887;
    auVar499._8_8_ = 0;
    auVar499._0_8_ = uVar888;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar898;
    auVar500._8_8_ = 0;
    auVar500._0_8_ = uVar884;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar902;
    auVar501._8_8_ = 0;
    auVar501._0_8_ = uVar901;
    auVar121 = auVar55 * auVar501 + auVar54 * auVar500 + (auVar121 >> 0x34);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auVar121._0_8_;
    auVar122 = auVar56 * ZEXT816(0x1000003d10) +
               auVar53 * auVar499 + auVar52 * auVar498 + auVar51 * auVar497 + (auVar822 >> 0x34);
    auVar124 = auVar122 >> 0x34;
    auVar840._8_8_ = 0;
    auVar840._0_8_ = auVar124._0_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auVar121._8_8_;
    auVar839._8_8_ = auVar124._8_8_;
    auVar839._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
    auVar840 = auVar57 * ZEXT816(0x1000003d10000) + auVar839 + auVar840;
    uVar889 = auVar840._0_8_;
    uVar888 = (b->x).n[0];
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar898;
    auVar502._8_8_ = 0;
    auVar502._0_8_ = uVar888;
    uVar886 = (b->x).n[1];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar887;
    auVar503._8_8_ = 0;
    auVar503._0_8_ = uVar886;
    uVar901 = (b->x).n[2];
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar892;
    auVar504._8_8_ = 0;
    auVar504._0_8_ = uVar901;
    uVar908 = (b->x).n[3];
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar882;
    auVar505._8_8_ = 0;
    auVar505._0_8_ = uVar908;
    uVar884 = (b->x).n[4];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar902;
    auVar506._8_8_ = 0;
    auVar506._0_8_ = uVar884;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = SUB168(auVar62 * auVar506,0);
    uVar904 = (auVar840._8_8_ << 0xc | uVar889 >> 0x34) + (auVar123._0_8_ & 0xffffffffffff);
    auVar120 = auVar63 * ZEXT816(0x1000003d10) +
               auVar58 * auVar502 + auVar59 * auVar503 + auVar61 * auVar505 + auVar60 * auVar504;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar902;
    auVar507._8_8_ = 0;
    auVar507._0_8_ = uVar888;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar898;
    auVar508._8_8_ = 0;
    auVar508._0_8_ = uVar886;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar887;
    auVar509._8_8_ = 0;
    auVar509._0_8_ = uVar901;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar892;
    auVar510._8_8_ = 0;
    auVar510._0_8_ = uVar908;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar882;
    auVar511._8_8_ = 0;
    auVar511._0_8_ = uVar884;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = SUB168(auVar62 * auVar506,8);
    auVar121 = auVar69 * ZEXT816(0x1000003d10000) +
               auVar64 * auVar507 +
               auVar65 * auVar508 + auVar66 * auVar509 + auVar68 * auVar511 + auVar67 * auVar510 +
               (auVar120 >> 0x34);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar882;
    auVar512._8_8_ = 0;
    auVar512._0_8_ = uVar888;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar902;
    auVar513._8_8_ = 0;
    auVar513._0_8_ = uVar886;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar898;
    auVar514._8_8_ = 0;
    auVar514._0_8_ = uVar901;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar887;
    auVar515._8_8_ = 0;
    auVar515._0_8_ = uVar908;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar892;
    auVar516._8_8_ = 0;
    auVar516._0_8_ = uVar884;
    auVar123 = (auVar121 >> 0x34) +
               auVar74 * auVar516 + auVar73 * auVar515 + auVar72 * auVar514 + auVar71 * auVar513;
    uVar907 = auVar123._0_8_;
    uVar894 = auVar123._8_8_;
    auVar841._8_8_ = uVar894 >> 0x34;
    auVar841._0_8_ = uVar894 * 0x1000 | uVar907 >> 0x34;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar907 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar121._6_2_ & 0xf);
    auVar123 = auVar70 * auVar512 + auVar75 * ZEXT816(0x1000003d1);
    uVar907 = auVar123._0_8_;
    uVar894 = auVar123._8_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar892;
    auVar517._8_8_ = 0;
    auVar517._0_8_ = uVar888;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar882;
    auVar518._8_8_ = 0;
    auVar518._0_8_ = uVar886;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar902;
    auVar519._8_8_ = 0;
    auVar519._0_8_ = uVar901;
    auVar823._8_8_ = uVar894 >> 0x34;
    auVar823._0_8_ = uVar894 * 0x1000 | uVar907 >> 0x34;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar898;
    auVar520._8_8_ = 0;
    auVar520._0_8_ = uVar908;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar887;
    auVar521._8_8_ = 0;
    auVar521._0_8_ = uVar884;
    auVar841 = auVar78 * auVar519 + auVar80 * auVar521 + auVar79 * auVar520 + auVar841;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = auVar841._0_8_ & 0xfffffffffffff;
    auVar823 = auVar81 * ZEXT816(0x1000003d10) + auVar76 * auVar517 + auVar77 * auVar518 + auVar823;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar887;
    auVar522._8_8_ = 0;
    auVar522._0_8_ = uVar888;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar892;
    auVar523._8_8_ = 0;
    auVar523._0_8_ = uVar886;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar882;
    auVar524._8_8_ = 0;
    auVar524._0_8_ = uVar901;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar902;
    auVar525._8_8_ = 0;
    auVar525._0_8_ = uVar908;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar898;
    auVar526._8_8_ = 0;
    auVar526._0_8_ = uVar884;
    auVar123 = auVar86 * auVar526 + auVar85 * auVar525 + (auVar841 >> 0x34);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = auVar123._0_8_;
    auVar124 = auVar87 * ZEXT816(0x1000003d10) +
               auVar82 * auVar522 + auVar84 * auVar524 + auVar83 * auVar523 + (auVar823 >> 0x34);
    (r->x).n[0] = uVar907 & 0xfffffffffffff;
    auVar125 = auVar124 >> 0x34;
    auVar843._8_8_ = 0;
    auVar843._0_8_ = auVar125._0_8_;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = auVar123._8_8_;
    auVar842._8_8_ = auVar125._8_8_;
    auVar842._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
    (r->x).n[1] = auVar823._0_8_ & 0xfffffffffffff;
    auVar843 = auVar88 * ZEXT816(0x1000003d10000) + auVar842 + auVar843;
    uVar888 = auVar843._0_8_;
    (r->x).n[2] = auVar124._0_8_ & 0xfffffffffffff;
    (r->x).n[3] = uVar888 & 0xfffffffffffff;
    (r->x).n[4] = (auVar843._8_8_ << 0xc | uVar888 >> 0x34) + (auVar121._0_8_ & 0xffffffffffff);
    uVar888 = (b->y).n[0];
    uVar886 = (b->y).n[1];
    uVar901 = (b->y).n[2];
    uVar908 = (b->y).n[3];
    uVar884 = (b->y).n[4];
    uVar889 = uVar889 & 0xfffffffffffff;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar889;
    auVar527._8_8_ = 0;
    auVar527._0_8_ = uVar888;
    uVar882 = auVar122._0_8_ & 0xfffffffffffff;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar882;
    auVar528._8_8_ = 0;
    auVar528._0_8_ = uVar886;
    uVar892 = auVar822._0_8_ & 0xfffffffffffff;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar892;
    auVar529._8_8_ = 0;
    auVar529._0_8_ = uVar901;
    uVar883 = uVar883 & 0xfffffffffffff;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar883;
    auVar530._8_8_ = 0;
    auVar530._0_8_ = uVar908;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar904;
    auVar531._8_8_ = 0;
    auVar531._0_8_ = uVar884;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = SUB168(auVar93 * auVar531,0);
    auVar120 = auVar94 * ZEXT816(0x1000003d10) +
               auVar89 * auVar527 + auVar90 * auVar528 + auVar92 * auVar530 + auVar91 * auVar529;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar904;
    auVar532._8_8_ = 0;
    auVar532._0_8_ = uVar888;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar889;
    auVar533._8_8_ = 0;
    auVar533._0_8_ = uVar886;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar882;
    auVar534._8_8_ = 0;
    auVar534._0_8_ = uVar901;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar892;
    auVar535._8_8_ = 0;
    auVar535._0_8_ = uVar908;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar883;
    auVar536._8_8_ = 0;
    auVar536._0_8_ = uVar884;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = SUB168(auVar93 * auVar531,8);
    auVar121 = auVar100 * ZEXT816(0x1000003d10000) +
               auVar95 * auVar532 +
               auVar96 * auVar533 + auVar97 * auVar534 + auVar99 * auVar536 + auVar98 * auVar535 +
               (auVar120 >> 0x34);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar883;
    auVar537._8_8_ = 0;
    auVar537._0_8_ = uVar888;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar904;
    auVar538._8_8_ = 0;
    auVar538._0_8_ = uVar886;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar889;
    auVar539._8_8_ = 0;
    auVar539._0_8_ = uVar901;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar882;
    auVar540._8_8_ = 0;
    auVar540._0_8_ = uVar908;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar892;
    auVar541._8_8_ = 0;
    auVar541._0_8_ = uVar884;
    auVar122 = (auVar121 >> 0x34) +
               auVar103 * auVar539 + auVar105 * auVar541 + auVar104 * auVar540 + auVar102 * auVar538
    ;
    uVar907 = auVar122._0_8_;
    uVar887 = auVar122._8_8_;
    auVar824._8_8_ = uVar887 >> 0x34;
    auVar824._0_8_ = uVar887 * 0x1000 | uVar907 >> 0x34;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar907 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar121._6_2_ & 0xf);
    auVar122 = auVar101 * auVar537 + auVar106 * ZEXT816(0x1000003d1);
    uVar907 = auVar122._0_8_;
    uVar887 = auVar122._8_8_;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar892;
    auVar542._8_8_ = 0;
    auVar542._0_8_ = uVar888;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar883;
    auVar543._8_8_ = 0;
    auVar543._0_8_ = uVar886;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar904;
    auVar544._8_8_ = 0;
    auVar544._0_8_ = uVar901;
    auVar825._8_8_ = uVar887 >> 0x34;
    auVar825._0_8_ = uVar887 * 0x1000 | uVar907 >> 0x34;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar889;
    auVar545._8_8_ = 0;
    auVar545._0_8_ = uVar908;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar882;
    auVar546._8_8_ = 0;
    auVar546._0_8_ = uVar884;
    auVar824 = auVar109 * auVar544 + auVar111 * auVar546 + auVar110 * auVar545 + auVar824;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = auVar824._0_8_ & 0xfffffffffffff;
    auVar825 = auVar112 * ZEXT816(0x1000003d10) + auVar107 * auVar542 + auVar108 * auVar543 +
               auVar825;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar882;
    auVar547._8_8_ = 0;
    auVar547._0_8_ = uVar888;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar892;
    auVar548._8_8_ = 0;
    auVar548._0_8_ = uVar886;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar883;
    auVar549._8_8_ = 0;
    auVar549._0_8_ = uVar901;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar904;
    auVar550._8_8_ = 0;
    auVar550._0_8_ = uVar908;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar889;
    auVar551._8_8_ = 0;
    auVar551._0_8_ = uVar884;
    auVar122 = auVar117 * auVar551 + auVar116 * auVar550 + (auVar824 >> 0x34);
    (r->y).n[0] = uVar907 & 0xfffffffffffff;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = auVar122._0_8_;
    (r->y).n[1] = auVar825._0_8_ & 0xfffffffffffff;
    auVar123 = auVar118 * ZEXT816(0x1000003d10) +
               auVar113 * auVar547 + auVar115 * auVar549 + auVar114 * auVar548 + (auVar825 >> 0x34);
    auVar124 = auVar123 >> 0x34;
    auVar845._8_8_ = 0;
    auVar845._0_8_ = auVar124._0_8_;
    (r->y).n[2] = auVar123._0_8_ & 0xfffffffffffff;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = auVar122._8_8_;
    auVar844._8_8_ = auVar124._8_8_;
    auVar844._0_8_ = auVar120._0_8_ & 0xfffffffffffff;
    auVar845 = auVar119 * ZEXT816(0x1000003d10000) + auVar844 + auVar845;
    uVar888 = auVar845._0_8_;
    (r->y).n[3] = uVar888 & 0xfffffffffffff;
    (r->y).n[4] = (auVar845._8_8_ << 0xc | uVar888 >> 0x34) + (auVar121._0_8_ & 0xffffffffffff);
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_gej_add_zinv_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, const secp256k1_fe *bzinv) {
    /* Operations: 9 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe az, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    SECP256K1_FE_VERIFY(bzinv);

    if (a->infinity) {
        secp256k1_fe bzinv2, bzinv3;
        r->infinity = b->infinity;
        secp256k1_fe_sqr(&bzinv2, bzinv);
        secp256k1_fe_mul(&bzinv3, &bzinv2, bzinv);
        secp256k1_fe_mul(&r->x, &b->x, &bzinv2);
        secp256k1_fe_mul(&r->y, &b->y, &bzinv3);
        secp256k1_fe_set_int(&r->z, 1);
        SECP256K1_GEJ_VERIFY(r);
        return;
    }
    if (b->infinity) {
        *r = *a;
        return;
    }

    /** We need to calculate (rx,ry,rz) = (ax,ay,az) + (bx,by,1/bzinv). Due to
     *  secp256k1's isomorphism we can multiply the Z coordinates on both sides
     *  by bzinv, and get: (rx,ry,rz*bzinv) = (ax,ay,az*bzinv) + (bx,by,1).
     *  This means that (rx,ry,rz) can be calculated as
     *  (ax,ay,az*bzinv) + (bx,by,1), when not applying the bzinv factor to rz.
     *  The variable az below holds the modified Z coordinate for a, which is used
     *  for the computation of rx and ry, but not for rz.
     */
    secp256k1_fe_mul(&az, &a->z, bzinv);

    secp256k1_fe_sqr(&z12, &az);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &az);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, NULL);
        } else {
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}